

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::sse2::CurveNiMBIntersector1<4>::
     intersect_h<embree::sse2::SweepCurve1Intersector1<embree::HermiteCurveT>,embree::sse2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  RTCRayQueryFlags *pRVar3;
  float *pfVar4;
  float *pfVar5;
  RTCRayQueryFlags *pRVar6;
  Primitive *pPVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  Primitive PVar16;
  Geometry *pGVar17;
  __int_type_conflict _Var18;
  long lVar19;
  RTCFilterFunctionN p_Var20;
  long lVar21;
  long lVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  undefined8 uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined6 uVar39;
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  undefined1 auVar55 [12];
  undefined1 auVar56 [12];
  undefined1 auVar57 [12];
  undefined1 auVar58 [12];
  undefined1 auVar59 [12];
  undefined1 auVar60 [12];
  int iVar61;
  undefined4 uVar62;
  ulong uVar63;
  ulong uVar64;
  RayHit *extraout_RAX;
  RayHit *extraout_RAX_00;
  RayHit *extraout_RAX_01;
  RayHit *extraout_RAX_02;
  RayHit *pRVar65;
  undefined4 uVar67;
  RayHit *extraout_RAX_03;
  RayHit *extraout_RAX_04;
  RayHit *extraout_RAX_05;
  RayHit *extraout_RAX_06;
  RayHit *pRVar66;
  RTCIntersectArguments *pRVar68;
  ulong uVar69;
  long lVar70;
  long lVar71;
  ulong uVar72;
  long lVar73;
  bool bVar74;
  uint uVar75;
  uint uVar76;
  uint uVar77;
  uint uVar78;
  short sVar79;
  undefined2 uVar119;
  float fVar80;
  uint uVar81;
  float fVar120;
  float fVar122;
  __m128 a_1;
  uint uVar121;
  uint uVar123;
  uint uVar124;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar88 [16];
  undefined1 auVar91 [16];
  undefined1 auVar94 [16];
  undefined1 auVar97 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar125;
  float fVar152;
  float fVar153;
  undefined1 auVar126 [16];
  undefined1 auVar129 [16];
  undefined1 auVar132 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar154;
  float fVar167;
  float fVar168;
  vfloat4 v;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar169;
  float fVar184;
  float fVar185;
  vfloat4 v_1;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  float fVar186;
  float fVar203;
  float fVar204;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar205;
  float fVar227;
  float fVar228;
  undefined1 auVar206 [16];
  undefined1 auVar209 [16];
  undefined1 auVar212 [16];
  undefined1 auVar215 [16];
  undefined1 auVar218 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  float fVar229;
  float fVar232;
  float fVar233;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar234;
  float fVar247;
  float fVar248;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  float fVar249;
  float fVar260;
  float fVar261;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar256 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  float fVar262;
  float fVar272;
  float fVar273;
  undefined1 auVar263 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  float fVar274;
  float fVar281;
  float fVar282;
  undefined1 auVar275 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  float fVar283;
  float fVar292;
  float fVar293;
  float fVar294;
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  float fVar295;
  float fVar296;
  float fVar305;
  float fVar307;
  float fVar309;
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar301 [16];
  float fVar306;
  float fVar308;
  float fVar310;
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  float fVar311;
  float fVar312;
  float fVar315;
  float fVar316;
  vfloat4 a;
  float fVar317;
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  float fVar318;
  float fVar321;
  float fVar322;
  float fVar323;
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  RTCFilterFunctionNArguments args;
  vfloatx vu0;
  vfloatx u_outer1;
  vfloatx u_outer0;
  BBox<embree::vfloat_impl<4>_> tp1;
  BBox<embree::vfloat_impl<4>_> tp0;
  StackEntry stack [4];
  undefined1 local_5f8 [8];
  float fStack_5f0;
  float fStack_5ec;
  undefined4 local_5bc;
  undefined1 local_5b8 [16];
  RTCIntersectArguments *local_5a0;
  undefined1 local_598 [8];
  float fStack_590;
  float fStack_58c;
  float local_588;
  float fStack_584;
  float fStack_580;
  float fStack_57c;
  undefined1 local_578 [8];
  float fStack_570;
  float fStack_56c;
  undefined1 local_568 [8];
  float fStack_560;
  float fStack_55c;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  undefined1 local_528 [8];
  float fStack_520;
  float fStack_51c;
  ulong local_510;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  RTCFilterFunctionNArguments local_4f8;
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  ulong local_4a0;
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  undefined8 local_468;
  float fStack_460;
  float fStack_45c;
  undefined4 local_458;
  uint local_454;
  uint local_450;
  uint local_44c;
  uint local_448;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  float local_408;
  float fStack_404;
  undefined4 uStack_400;
  undefined4 uStack_3fc;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [16];
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [16];
  float local_2d8 [4];
  float local_2c8 [6];
  RayQueryContext *local_2b0;
  Primitive *local_2a8;
  ulong local_2a0;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [16];
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  uint auStack_f8 [4];
  float afStack_e8 [6];
  float afStack_d0 [40];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 uVar118;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar159 [16];
  undefined1 auVar162 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar255 [16];
  undefined1 auVar257 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  
  PVar16 = prim[1];
  uVar63 = (ulong)(byte)PVar16;
  lVar73 = uVar63 * 0x25;
  pPVar7 = prim + lVar73 + 6;
  fVar168 = *(float *)(pPVar7 + 0xc);
  fVar169 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar7) * fVar168;
  fVar184 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar7 + 4)) * fVar168;
  fVar185 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar7 + 8)) * fVar168;
  fVar154 = fVar168 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar167 = fVar168 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar168 = fVar168 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar67 = *(undefined4 *)(prim + uVar63 * 4 + 6);
  uVar118 = (undefined1)((uint)uVar67 >> 0x18);
  uVar119 = CONCAT11(uVar118,uVar118);
  uVar118 = (undefined1)((uint)uVar67 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar119,uVar118),CONCAT14(uVar118,uVar67));
  uVar118 = (undefined1)((uint)uVar67 >> 8);
  uVar39 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar118),uVar118);
  sVar79 = CONCAT11((char)uVar67,(char)uVar67);
  uVar64 = CONCAT62(uVar39,sVar79);
  auVar82._8_4_ = 0;
  auVar82._0_8_ = uVar64;
  auVar82._12_2_ = uVar119;
  auVar82._14_2_ = uVar119;
  uVar119 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar156._12_4_ = auVar82._12_4_;
  auVar156._8_2_ = 0;
  auVar156._0_8_ = uVar64;
  auVar156._10_2_ = uVar119;
  auVar267._10_6_ = auVar156._10_6_;
  auVar267._8_2_ = uVar119;
  auVar267._0_8_ = uVar64;
  uVar119 = (undefined2)uVar39;
  auVar40._4_8_ = auVar267._8_8_;
  auVar40._2_2_ = uVar119;
  auVar40._0_2_ = uVar119;
  fVar311 = (float)((int)sVar79 >> 8);
  fVar315 = (float)(auVar40._0_4_ >> 0x18);
  fVar316 = (float)(auVar267._8_4_ >> 0x18);
  uVar67 = *(undefined4 *)(prim + uVar63 * 5 + 6);
  uVar118 = (undefined1)((uint)uVar67 >> 0x18);
  uVar119 = CONCAT11(uVar118,uVar118);
  uVar118 = (undefined1)((uint)uVar67 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar119,uVar118),CONCAT14(uVar118,uVar67));
  uVar118 = (undefined1)((uint)uVar67 >> 8);
  uVar39 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar118),uVar118);
  sVar79 = CONCAT11((char)uVar67,(char)uVar67);
  uVar64 = CONCAT62(uVar39,sVar79);
  auVar128._8_4_ = 0;
  auVar128._0_8_ = uVar64;
  auVar128._12_2_ = uVar119;
  auVar128._14_2_ = uVar119;
  uVar119 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar127._12_4_ = auVar128._12_4_;
  auVar127._8_2_ = 0;
  auVar127._0_8_ = uVar64;
  auVar127._10_2_ = uVar119;
  auVar126._10_6_ = auVar127._10_6_;
  auVar126._8_2_ = uVar119;
  auVar126._0_8_ = uVar64;
  uVar119 = (undefined2)uVar39;
  auVar41._4_8_ = auVar126._8_8_;
  auVar41._2_2_ = uVar119;
  auVar41._0_2_ = uVar119;
  fVar186 = (float)((int)sVar79 >> 8);
  fVar203 = (float)(auVar41._0_4_ >> 0x18);
  fVar204 = (float)(auVar126._8_4_ >> 0x18);
  uVar67 = *(undefined4 *)(prim + uVar63 * 6 + 6);
  uVar118 = (undefined1)((uint)uVar67 >> 0x18);
  uVar119 = CONCAT11(uVar118,uVar118);
  uVar118 = (undefined1)((uint)uVar67 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar119,uVar118),CONCAT14(uVar118,uVar67));
  uVar118 = (undefined1)((uint)uVar67 >> 8);
  uVar39 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar118),uVar118);
  sVar79 = CONCAT11((char)uVar67,(char)uVar67);
  uVar64 = CONCAT62(uVar39,sVar79);
  auVar131._8_4_ = 0;
  auVar131._0_8_ = uVar64;
  auVar131._12_2_ = uVar119;
  auVar131._14_2_ = uVar119;
  uVar119 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar130._12_4_ = auVar131._12_4_;
  auVar130._8_2_ = 0;
  auVar130._0_8_ = uVar64;
  auVar130._10_2_ = uVar119;
  auVar129._10_6_ = auVar130._10_6_;
  auVar129._8_2_ = uVar119;
  auVar129._0_8_ = uVar64;
  uVar119 = (undefined2)uVar39;
  auVar42._4_8_ = auVar129._8_8_;
  auVar42._2_2_ = uVar119;
  auVar42._0_2_ = uVar119;
  fVar229 = (float)((int)sVar79 >> 8);
  fVar232 = (float)(auVar42._0_4_ >> 0x18);
  fVar233 = (float)(auVar129._8_4_ >> 0x18);
  uVar67 = *(undefined4 *)(prim + uVar63 * 0xf + 6);
  uVar118 = (undefined1)((uint)uVar67 >> 0x18);
  uVar119 = CONCAT11(uVar118,uVar118);
  uVar118 = (undefined1)((uint)uVar67 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar119,uVar118),CONCAT14(uVar118,uVar67));
  uVar118 = (undefined1)((uint)uVar67 >> 8);
  uVar39 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar118),uVar118);
  sVar79 = CONCAT11((char)uVar67,(char)uVar67);
  uVar64 = CONCAT62(uVar39,sVar79);
  auVar134._8_4_ = 0;
  auVar134._0_8_ = uVar64;
  auVar134._12_2_ = uVar119;
  auVar134._14_2_ = uVar119;
  uVar119 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar133._12_4_ = auVar134._12_4_;
  auVar133._8_2_ = 0;
  auVar133._0_8_ = uVar64;
  auVar133._10_2_ = uVar119;
  auVar132._10_6_ = auVar133._10_6_;
  auVar132._8_2_ = uVar119;
  auVar132._0_8_ = uVar64;
  uVar119 = (undefined2)uVar39;
  auVar43._4_8_ = auVar132._8_8_;
  auVar43._2_2_ = uVar119;
  auVar43._0_2_ = uVar119;
  fVar80 = (float)((int)sVar79 >> 8);
  fVar120 = (float)(auVar43._0_4_ >> 0x18);
  fVar122 = (float)(auVar132._8_4_ >> 0x18);
  uVar67 = *(undefined4 *)(prim + (ulong)(byte)PVar16 * 0x10 + 6);
  uVar118 = (undefined1)((uint)uVar67 >> 0x18);
  uVar119 = CONCAT11(uVar118,uVar118);
  uVar118 = (undefined1)((uint)uVar67 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar119,uVar118),CONCAT14(uVar118,uVar67));
  uVar118 = (undefined1)((uint)uVar67 >> 8);
  uVar39 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar118),uVar118);
  sVar79 = CONCAT11((char)uVar67,(char)uVar67);
  uVar64 = CONCAT62(uVar39,sVar79);
  auVar208._8_4_ = 0;
  auVar208._0_8_ = uVar64;
  auVar208._12_2_ = uVar119;
  auVar208._14_2_ = uVar119;
  uVar119 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar207._12_4_ = auVar208._12_4_;
  auVar207._8_2_ = 0;
  auVar207._0_8_ = uVar64;
  auVar207._10_2_ = uVar119;
  auVar206._10_6_ = auVar207._10_6_;
  auVar206._8_2_ = uVar119;
  auVar206._0_8_ = uVar64;
  uVar119 = (undefined2)uVar39;
  auVar44._4_8_ = auVar206._8_8_;
  auVar44._2_2_ = uVar119;
  auVar44._0_2_ = uVar119;
  fVar234 = (float)((int)sVar79 >> 8);
  fVar247 = (float)(auVar44._0_4_ >> 0x18);
  fVar248 = (float)(auVar206._8_4_ >> 0x18);
  uVar67 = *(undefined4 *)(prim + (ulong)(byte)PVar16 * 0x10 + uVar63 + 6);
  uVar118 = (undefined1)((uint)uVar67 >> 0x18);
  uVar119 = CONCAT11(uVar118,uVar118);
  uVar118 = (undefined1)((uint)uVar67 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar119,uVar118),CONCAT14(uVar118,uVar67));
  uVar118 = (undefined1)((uint)uVar67 >> 8);
  uVar39 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar118),uVar118);
  sVar79 = CONCAT11((char)uVar67,(char)uVar67);
  uVar64 = CONCAT62(uVar39,sVar79);
  auVar211._8_4_ = 0;
  auVar211._0_8_ = uVar64;
  auVar211._12_2_ = uVar119;
  auVar211._14_2_ = uVar119;
  uVar119 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar210._12_4_ = auVar211._12_4_;
  auVar210._8_2_ = 0;
  auVar210._0_8_ = uVar64;
  auVar210._10_2_ = uVar119;
  auVar209._10_6_ = auVar210._10_6_;
  auVar209._8_2_ = uVar119;
  auVar209._0_8_ = uVar64;
  uVar119 = (undefined2)uVar39;
  auVar45._4_8_ = auVar209._8_8_;
  auVar45._2_2_ = uVar119;
  auVar45._0_2_ = uVar119;
  fVar262 = (float)((int)sVar79 >> 8);
  fVar272 = (float)(auVar45._0_4_ >> 0x18);
  fVar273 = (float)(auVar209._8_4_ >> 0x18);
  uVar67 = *(undefined4 *)(prim + uVar63 * 0x1a + 6);
  uVar118 = (undefined1)((uint)uVar67 >> 0x18);
  uVar119 = CONCAT11(uVar118,uVar118);
  uVar118 = (undefined1)((uint)uVar67 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar119,uVar118),CONCAT14(uVar118,uVar67));
  uVar118 = (undefined1)((uint)uVar67 >> 8);
  uVar39 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar118),uVar118);
  sVar79 = CONCAT11((char)uVar67,(char)uVar67);
  uVar64 = CONCAT62(uVar39,sVar79);
  auVar214._8_4_ = 0;
  auVar214._0_8_ = uVar64;
  auVar214._12_2_ = uVar119;
  auVar214._14_2_ = uVar119;
  uVar119 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar213._12_4_ = auVar214._12_4_;
  auVar213._8_2_ = 0;
  auVar213._0_8_ = uVar64;
  auVar213._10_2_ = uVar119;
  auVar212._10_6_ = auVar213._10_6_;
  auVar212._8_2_ = uVar119;
  auVar212._0_8_ = uVar64;
  uVar119 = (undefined2)uVar39;
  auVar46._4_8_ = auVar212._8_8_;
  auVar46._2_2_ = uVar119;
  auVar46._0_2_ = uVar119;
  fVar249 = (float)((int)sVar79 >> 8);
  fVar260 = (float)(auVar46._0_4_ >> 0x18);
  fVar261 = (float)(auVar212._8_4_ >> 0x18);
  uVar67 = *(undefined4 *)(prim + uVar63 * 0x1b + 6);
  uVar118 = (undefined1)((uint)uVar67 >> 0x18);
  uVar119 = CONCAT11(uVar118,uVar118);
  uVar118 = (undefined1)((uint)uVar67 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar119,uVar118),CONCAT14(uVar118,uVar67));
  uVar118 = (undefined1)((uint)uVar67 >> 8);
  uVar39 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar118),uVar118);
  sVar79 = CONCAT11((char)uVar67,(char)uVar67);
  uVar64 = CONCAT62(uVar39,sVar79);
  auVar217._8_4_ = 0;
  auVar217._0_8_ = uVar64;
  auVar217._12_2_ = uVar119;
  auVar217._14_2_ = uVar119;
  uVar119 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar216._12_4_ = auVar217._12_4_;
  auVar216._8_2_ = 0;
  auVar216._0_8_ = uVar64;
  auVar216._10_2_ = uVar119;
  auVar215._10_6_ = auVar216._10_6_;
  auVar215._8_2_ = uVar119;
  auVar215._0_8_ = uVar64;
  uVar119 = (undefined2)uVar39;
  auVar47._4_8_ = auVar215._8_8_;
  auVar47._2_2_ = uVar119;
  auVar47._0_2_ = uVar119;
  fVar274 = (float)((int)sVar79 >> 8);
  fVar281 = (float)(auVar47._0_4_ >> 0x18);
  fVar282 = (float)(auVar215._8_4_ >> 0x18);
  uVar67 = *(undefined4 *)(prim + uVar63 * 0x1c + 6);
  uVar118 = (undefined1)((uint)uVar67 >> 0x18);
  uVar119 = CONCAT11(uVar118,uVar118);
  uVar118 = (undefined1)((uint)uVar67 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar119,uVar118),CONCAT14(uVar118,uVar67));
  uVar118 = (undefined1)((uint)uVar67 >> 8);
  uVar39 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar118),uVar118);
  sVar79 = CONCAT11((char)uVar67,(char)uVar67);
  uVar64 = CONCAT62(uVar39,sVar79);
  auVar220._8_4_ = 0;
  auVar220._0_8_ = uVar64;
  auVar220._12_2_ = uVar119;
  auVar220._14_2_ = uVar119;
  uVar119 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar219._12_4_ = auVar220._12_4_;
  auVar219._8_2_ = 0;
  auVar219._0_8_ = uVar64;
  auVar219._10_2_ = uVar119;
  auVar218._10_6_ = auVar219._10_6_;
  auVar218._8_2_ = uVar119;
  auVar218._0_8_ = uVar64;
  uVar119 = (undefined2)uVar39;
  auVar48._4_8_ = auVar218._8_8_;
  auVar48._2_2_ = uVar119;
  auVar48._0_2_ = uVar119;
  fVar125 = (float)((int)sVar79 >> 8);
  fVar152 = (float)(auVar48._0_4_ >> 0x18);
  fVar153 = (float)(auVar218._8_4_ >> 0x18);
  fVar295 = fVar154 * fVar311 + fVar167 * fVar186 + fVar168 * fVar229;
  fVar305 = fVar154 * fVar315 + fVar167 * fVar203 + fVar168 * fVar232;
  fVar307 = fVar154 * fVar316 + fVar167 * fVar204 + fVar168 * fVar233;
  fVar309 = fVar154 * (float)(auVar156._12_4_ >> 0x18) +
            fVar167 * (float)(auVar127._12_4_ >> 0x18) + fVar168 * (float)(auVar130._12_4_ >> 0x18);
  fVar283 = fVar154 * fVar80 + fVar167 * fVar234 + fVar168 * fVar262;
  fVar292 = fVar154 * fVar120 + fVar167 * fVar247 + fVar168 * fVar272;
  fVar293 = fVar154 * fVar122 + fVar167 * fVar248 + fVar168 * fVar273;
  fVar294 = fVar154 * (float)(auVar133._12_4_ >> 0x18) +
            fVar167 * (float)(auVar207._12_4_ >> 0x18) + fVar168 * (float)(auVar210._12_4_ >> 0x18);
  fVar205 = fVar154 * fVar249 + fVar167 * fVar274 + fVar168 * fVar125;
  fVar227 = fVar154 * fVar260 + fVar167 * fVar281 + fVar168 * fVar152;
  fVar228 = fVar154 * fVar261 + fVar167 * fVar282 + fVar168 * fVar153;
  fVar168 = fVar154 * (float)(auVar213._12_4_ >> 0x18) +
            fVar167 * (float)(auVar216._12_4_ >> 0x18) + fVar168 * (float)(auVar219._12_4_ >> 0x18);
  fVar312 = fVar311 * fVar169 + fVar186 * fVar184 + fVar229 * fVar185;
  fVar315 = fVar315 * fVar169 + fVar203 * fVar184 + fVar232 * fVar185;
  fVar316 = fVar316 * fVar169 + fVar204 * fVar184 + fVar233 * fVar185;
  fVar317 = (float)(auVar156._12_4_ >> 0x18) * fVar169 +
            (float)(auVar127._12_4_ >> 0x18) * fVar184 + (float)(auVar130._12_4_ >> 0x18) * fVar185;
  fVar262 = fVar80 * fVar169 + fVar234 * fVar184 + fVar262 * fVar185;
  fVar272 = fVar120 * fVar169 + fVar247 * fVar184 + fVar272 * fVar185;
  fVar273 = fVar122 * fVar169 + fVar248 * fVar184 + fVar273 * fVar185;
  fVar311 = (float)(auVar133._12_4_ >> 0x18) * fVar169 +
            (float)(auVar207._12_4_ >> 0x18) * fVar184 + (float)(auVar210._12_4_ >> 0x18) * fVar185;
  fVar249 = fVar169 * fVar249 + fVar184 * fVar274 + fVar185 * fVar125;
  fVar260 = fVar169 * fVar260 + fVar184 * fVar281 + fVar185 * fVar152;
  fVar261 = fVar169 * fVar261 + fVar184 * fVar282 + fVar185 * fVar153;
  fVar274 = fVar169 * (float)(auVar213._12_4_ >> 0x18) +
            fVar184 * (float)(auVar216._12_4_ >> 0x18) + fVar185 * (float)(auVar219._12_4_ >> 0x18);
  uVar81 = (uint)DAT_01fec6c0;
  uVar121 = DAT_01fec6c0._4_4_;
  uVar123 = DAT_01fec6c0._8_4_;
  uVar124 = DAT_01fec6c0._12_4_;
  uVar75 = -(uint)(1e-18 <= (float)((uint)fVar295 & uVar81));
  uVar76 = -(uint)(1e-18 <= (float)((uint)fVar305 & uVar121));
  uVar77 = -(uint)(1e-18 <= (float)((uint)fVar307 & uVar123));
  uVar78 = -(uint)(1e-18 <= (float)((uint)fVar309 & uVar124));
  auVar297._0_4_ = (uint)fVar295 & uVar75;
  auVar297._4_4_ = (uint)fVar305 & uVar76;
  auVar297._8_4_ = (uint)fVar307 & uVar77;
  auVar297._12_4_ = (uint)fVar309 & uVar78;
  auVar170._0_8_ = CONCAT44(~uVar76,~uVar75) & 0x219392ef219392ef;
  auVar170._8_4_ = ~uVar77 & 0x219392ef;
  auVar170._12_4_ = ~uVar78 & 0x219392ef;
  auVar170 = auVar170 | auVar297;
  uVar75 = -(uint)(1e-18 <= (float)((uint)fVar283 & uVar81));
  uVar76 = -(uint)(1e-18 <= (float)((uint)fVar292 & uVar121));
  uVar77 = -(uint)(1e-18 <= (float)((uint)fVar293 & uVar123));
  uVar78 = -(uint)(1e-18 <= (float)((uint)fVar294 & uVar124));
  auVar284._0_4_ = (uint)fVar283 & uVar75;
  auVar284._4_4_ = (uint)fVar292 & uVar76;
  auVar284._8_4_ = (uint)fVar293 & uVar77;
  auVar284._12_4_ = (uint)fVar294 & uVar78;
  auVar230._0_8_ = CONCAT44(~uVar76,~uVar75) & 0x219392ef219392ef;
  auVar230._8_4_ = ~uVar77 & 0x219392ef;
  auVar230._12_4_ = ~uVar78 & 0x219392ef;
  auVar230 = auVar230 | auVar284;
  uVar75 = -(uint)(1e-18 <= (float)((uint)fVar205 & uVar81));
  uVar76 = -(uint)(1e-18 <= (float)((uint)fVar227 & uVar121));
  uVar77 = -(uint)(1e-18 <= (float)((uint)fVar228 & uVar123));
  uVar78 = -(uint)(1e-18 <= (float)((uint)fVar168 & uVar124));
  auVar221._0_4_ = (uint)fVar205 & uVar75;
  auVar221._4_4_ = (uint)fVar227 & uVar76;
  auVar221._8_4_ = (uint)fVar228 & uVar77;
  auVar221._12_4_ = (uint)fVar168 & uVar78;
  auVar235._0_8_ = CONCAT44(~uVar76,~uVar75) & 0x219392ef219392ef;
  auVar235._8_4_ = ~uVar77 & 0x219392ef;
  auVar235._12_4_ = ~uVar78 & 0x219392ef;
  auVar235 = auVar235 | auVar221;
  auVar82 = rcpps(_DAT_01fec6c0,auVar170);
  fVar168 = auVar82._0_4_;
  fVar122 = auVar82._4_4_;
  fVar186 = auVar82._8_4_;
  fVar234 = auVar82._12_4_;
  fVar168 = (1.0 - auVar170._0_4_ * fVar168) * fVar168 + fVar168;
  fVar122 = (1.0 - auVar170._4_4_ * fVar122) * fVar122 + fVar122;
  fVar186 = (1.0 - auVar170._8_4_ * fVar186) * fVar186 + fVar186;
  fVar234 = (1.0 - auVar170._12_4_ * fVar234) * fVar234 + fVar234;
  auVar82 = rcpps(auVar82,auVar230);
  fVar80 = auVar82._0_4_;
  fVar125 = auVar82._4_4_;
  fVar203 = auVar82._8_4_;
  fVar247 = auVar82._12_4_;
  fVar80 = (1.0 - auVar230._0_4_ * fVar80) * fVar80 + fVar80;
  fVar125 = (1.0 - auVar230._4_4_ * fVar125) * fVar125 + fVar125;
  fVar203 = (1.0 - auVar230._8_4_ * fVar203) * fVar203 + fVar203;
  fVar247 = (1.0 - auVar230._12_4_ * fVar247) * fVar247 + fVar247;
  auVar82 = rcpps(auVar82,auVar235);
  fVar120 = auVar82._0_4_;
  fVar152 = auVar82._4_4_;
  fVar204 = auVar82._8_4_;
  fVar248 = auVar82._12_4_;
  fVar120 = (1.0 - auVar235._0_4_ * fVar120) * fVar120 + fVar120;
  fVar152 = (1.0 - auVar235._4_4_ * fVar152) * fVar152 + fVar152;
  fVar204 = (1.0 - auVar235._8_4_ * fVar204) * fVar204 + fVar204;
  fVar248 = (1.0 - auVar235._12_4_ * fVar248) * fVar248 + fVar248;
  fVar281 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar73 + 0x16)) *
            *(float *)(prim + lVar73 + 0x1a);
  uVar64 = *(ulong *)(prim + uVar63 * 7 + 6);
  uVar119 = (undefined2)(uVar64 >> 0x30);
  auVar84._8_4_ = 0;
  auVar84._0_8_ = uVar64;
  auVar84._12_2_ = uVar119;
  auVar84._14_2_ = uVar119;
  uVar119 = (undefined2)(uVar64 >> 0x20);
  auVar83._12_4_ = auVar84._12_4_;
  auVar83._8_2_ = 0;
  auVar83._0_8_ = uVar64;
  auVar83._10_2_ = uVar119;
  auVar269._10_6_ = auVar83._10_6_;
  auVar269._8_2_ = uVar119;
  auVar269._0_8_ = uVar64;
  uVar119 = (undefined2)(uVar64 >> 0x10);
  auVar49._4_8_ = auVar269._8_8_;
  auVar49._2_2_ = uVar119;
  auVar49._0_2_ = uVar119;
  fVar153 = (float)(auVar49._0_4_ >> 0x10);
  fVar205 = (float)(auVar269._8_4_ >> 0x10);
  uVar69 = *(ulong *)(prim + uVar63 * 0xb + 6);
  uVar119 = (undefined2)(uVar69 >> 0x30);
  auVar173._8_4_ = 0;
  auVar173._0_8_ = uVar69;
  auVar173._12_2_ = uVar119;
  auVar173._14_2_ = uVar119;
  uVar119 = (undefined2)(uVar69 >> 0x20);
  auVar172._12_4_ = auVar173._12_4_;
  auVar172._8_2_ = 0;
  auVar172._0_8_ = uVar69;
  auVar172._10_2_ = uVar119;
  auVar171._10_6_ = auVar172._10_6_;
  auVar171._8_2_ = uVar119;
  auVar171._0_8_ = uVar69;
  uVar119 = (undefined2)(uVar69 >> 0x10);
  auVar50._4_8_ = auVar171._8_8_;
  auVar50._2_2_ = uVar119;
  auVar50._0_2_ = uVar119;
  uVar8 = *(ulong *)(prim + uVar63 * 9 + 6);
  uVar119 = (undefined2)(uVar8 >> 0x30);
  auVar87._8_4_ = 0;
  auVar87._0_8_ = uVar8;
  auVar87._12_2_ = uVar119;
  auVar87._14_2_ = uVar119;
  uVar119 = (undefined2)(uVar8 >> 0x20);
  auVar86._12_4_ = auVar87._12_4_;
  auVar86._8_2_ = 0;
  auVar86._0_8_ = uVar8;
  auVar86._10_2_ = uVar119;
  auVar85._10_6_ = auVar86._10_6_;
  auVar85._8_2_ = uVar119;
  auVar85._0_8_ = uVar8;
  uVar119 = (undefined2)(uVar8 >> 0x10);
  auVar51._4_8_ = auVar85._8_8_;
  auVar51._2_2_ = uVar119;
  auVar51._0_2_ = uVar119;
  fVar154 = (float)(auVar51._0_4_ >> 0x10);
  fVar227 = (float)(auVar85._8_4_ >> 0x10);
  uVar9 = *(ulong *)(prim + uVar63 * 0xd + 6);
  uVar119 = (undefined2)(uVar9 >> 0x30);
  auVar238._8_4_ = 0;
  auVar238._0_8_ = uVar9;
  auVar238._12_2_ = uVar119;
  auVar238._14_2_ = uVar119;
  uVar119 = (undefined2)(uVar9 >> 0x20);
  auVar237._12_4_ = auVar238._12_4_;
  auVar237._8_2_ = 0;
  auVar237._0_8_ = uVar9;
  auVar237._10_2_ = uVar119;
  auVar236._10_6_ = auVar237._10_6_;
  auVar236._8_2_ = uVar119;
  auVar236._0_8_ = uVar9;
  uVar119 = (undefined2)(uVar9 >> 0x10);
  auVar52._4_8_ = auVar236._8_8_;
  auVar52._2_2_ = uVar119;
  auVar52._0_2_ = uVar119;
  uVar10 = *(ulong *)(prim + uVar63 * 0x12 + 6);
  uVar119 = (undefined2)(uVar10 >> 0x30);
  auVar90._8_4_ = 0;
  auVar90._0_8_ = uVar10;
  auVar90._12_2_ = uVar119;
  auVar90._14_2_ = uVar119;
  uVar119 = (undefined2)(uVar10 >> 0x20);
  auVar89._12_4_ = auVar90._12_4_;
  auVar89._8_2_ = 0;
  auVar89._0_8_ = uVar10;
  auVar89._10_2_ = uVar119;
  auVar88._10_6_ = auVar89._10_6_;
  auVar88._8_2_ = uVar119;
  auVar88._0_8_ = uVar10;
  uVar119 = (undefined2)(uVar10 >> 0x10);
  auVar53._4_8_ = auVar88._8_8_;
  auVar53._2_2_ = uVar119;
  auVar53._0_2_ = uVar119;
  fVar167 = (float)(auVar53._0_4_ >> 0x10);
  fVar228 = (float)(auVar88._8_4_ >> 0x10);
  uVar72 = (ulong)(uint)((int)(uVar63 * 5) << 2);
  uVar11 = *(ulong *)(prim + uVar63 * 2 + uVar72 + 6);
  uVar119 = (undefined2)(uVar11 >> 0x30);
  auVar265._8_4_ = 0;
  auVar265._0_8_ = uVar11;
  auVar265._12_2_ = uVar119;
  auVar265._14_2_ = uVar119;
  uVar119 = (undefined2)(uVar11 >> 0x20);
  auVar264._12_4_ = auVar265._12_4_;
  auVar264._8_2_ = 0;
  auVar264._0_8_ = uVar11;
  auVar264._10_2_ = uVar119;
  auVar263._10_6_ = auVar264._10_6_;
  auVar263._8_2_ = uVar119;
  auVar263._0_8_ = uVar11;
  uVar119 = (undefined2)(uVar11 >> 0x10);
  auVar54._4_8_ = auVar263._8_8_;
  auVar54._2_2_ = uVar119;
  auVar54._0_2_ = uVar119;
  uVar72 = *(ulong *)(prim + uVar72 + 6);
  uVar119 = (undefined2)(uVar72 >> 0x30);
  auVar93._8_4_ = 0;
  auVar93._0_8_ = uVar72;
  auVar93._12_2_ = uVar119;
  auVar93._14_2_ = uVar119;
  uVar119 = (undefined2)(uVar72 >> 0x20);
  auVar92._12_4_ = auVar93._12_4_;
  auVar92._8_2_ = 0;
  auVar92._0_8_ = uVar72;
  auVar92._10_2_ = uVar119;
  auVar91._10_6_ = auVar92._10_6_;
  auVar91._8_2_ = uVar119;
  auVar91._0_8_ = uVar72;
  uVar119 = (undefined2)(uVar72 >> 0x10);
  auVar55._4_8_ = auVar91._8_8_;
  auVar55._2_2_ = uVar119;
  auVar55._0_2_ = uVar119;
  fVar169 = (float)(auVar55._0_4_ >> 0x10);
  fVar229 = (float)(auVar91._8_4_ >> 0x10);
  uVar12 = *(ulong *)(prim + uVar63 * 0x18 + 6);
  uVar119 = (undefined2)(uVar12 >> 0x30);
  auVar277._8_4_ = 0;
  auVar277._0_8_ = uVar12;
  auVar277._12_2_ = uVar119;
  auVar277._14_2_ = uVar119;
  uVar119 = (undefined2)(uVar12 >> 0x20);
  auVar276._12_4_ = auVar277._12_4_;
  auVar276._8_2_ = 0;
  auVar276._0_8_ = uVar12;
  auVar276._10_2_ = uVar119;
  auVar275._10_6_ = auVar276._10_6_;
  auVar275._8_2_ = uVar119;
  auVar275._0_8_ = uVar12;
  uVar119 = (undefined2)(uVar12 >> 0x10);
  auVar56._4_8_ = auVar275._8_8_;
  auVar56._2_2_ = uVar119;
  auVar56._0_2_ = uVar119;
  uVar13 = *(ulong *)(prim + uVar63 * 0x1d + 6);
  uVar119 = (undefined2)(uVar13 >> 0x30);
  auVar96._8_4_ = 0;
  auVar96._0_8_ = uVar13;
  auVar96._12_2_ = uVar119;
  auVar96._14_2_ = uVar119;
  uVar119 = (undefined2)(uVar13 >> 0x20);
  auVar95._12_4_ = auVar96._12_4_;
  auVar95._8_2_ = 0;
  auVar95._0_8_ = uVar13;
  auVar95._10_2_ = uVar119;
  auVar94._10_6_ = auVar95._10_6_;
  auVar94._8_2_ = uVar119;
  auVar94._0_8_ = uVar13;
  uVar119 = (undefined2)(uVar13 >> 0x10);
  auVar57._4_8_ = auVar94._8_8_;
  auVar57._2_2_ = uVar119;
  auVar57._0_2_ = uVar119;
  fVar184 = (float)(auVar57._0_4_ >> 0x10);
  fVar232 = (float)(auVar94._8_4_ >> 0x10);
  uVar14 = *(ulong *)(prim + uVar63 + (ulong)(byte)PVar16 * 0x20 + 6);
  uVar119 = (undefined2)(uVar14 >> 0x30);
  auVar287._8_4_ = 0;
  auVar287._0_8_ = uVar14;
  auVar287._12_2_ = uVar119;
  auVar287._14_2_ = uVar119;
  uVar119 = (undefined2)(uVar14 >> 0x20);
  auVar286._12_4_ = auVar287._12_4_;
  auVar286._8_2_ = 0;
  auVar286._0_8_ = uVar14;
  auVar286._10_2_ = uVar119;
  auVar285._10_6_ = auVar286._10_6_;
  auVar285._8_2_ = uVar119;
  auVar285._0_8_ = uVar14;
  uVar119 = (undefined2)(uVar14 >> 0x10);
  auVar58._4_8_ = auVar285._8_8_;
  auVar58._2_2_ = uVar119;
  auVar58._0_2_ = uVar119;
  uVar15 = *(ulong *)(prim + ((ulong)(byte)PVar16 * 0x20 - uVar63) + 6);
  uVar119 = (undefined2)(uVar15 >> 0x30);
  auVar99._8_4_ = 0;
  auVar99._0_8_ = uVar15;
  auVar99._12_2_ = uVar119;
  auVar99._14_2_ = uVar119;
  uVar119 = (undefined2)(uVar15 >> 0x20);
  auVar98._12_4_ = auVar99._12_4_;
  auVar98._8_2_ = 0;
  auVar98._0_8_ = uVar15;
  auVar98._10_2_ = uVar119;
  auVar97._10_6_ = auVar98._10_6_;
  auVar97._8_2_ = uVar119;
  auVar97._0_8_ = uVar15;
  uVar119 = (undefined2)(uVar15 >> 0x10);
  auVar59._4_8_ = auVar97._8_8_;
  auVar59._2_2_ = uVar119;
  auVar59._0_2_ = uVar119;
  fVar185 = (float)(auVar59._0_4_ >> 0x10);
  fVar233 = (float)(auVar97._8_4_ >> 0x10);
  uVar63 = *(ulong *)(prim + uVar63 * 0x23 + 6);
  uVar119 = (undefined2)(uVar63 >> 0x30);
  auVar300._8_4_ = 0;
  auVar300._0_8_ = uVar63;
  auVar300._12_2_ = uVar119;
  auVar300._14_2_ = uVar119;
  uVar119 = (undefined2)(uVar63 >> 0x20);
  auVar299._12_4_ = auVar300._12_4_;
  auVar299._8_2_ = 0;
  auVar299._0_8_ = uVar63;
  auVar299._10_2_ = uVar119;
  auVar298._10_6_ = auVar299._10_6_;
  auVar298._8_2_ = uVar119;
  auVar298._0_8_ = uVar63;
  uVar119 = (undefined2)(uVar63 >> 0x10);
  auVar60._4_8_ = auVar298._8_8_;
  auVar60._2_2_ = uVar119;
  auVar60._0_2_ = uVar119;
  auVar174._0_8_ =
       CONCAT44(((((float)(auVar50._0_4_ >> 0x10) - fVar153) * fVar281 + fVar153) - fVar315) *
                fVar122,((((float)(int)(short)uVar69 - (float)(int)(short)uVar64) * fVar281 +
                         (float)(int)(short)uVar64) - fVar312) * fVar168);
  auVar174._8_4_ =
       ((((float)(auVar171._8_4_ >> 0x10) - fVar205) * fVar281 + fVar205) - fVar316) * fVar186;
  auVar174._12_4_ =
       ((((float)(auVar172._12_4_ >> 0x10) - (float)(auVar83._12_4_ >> 0x10)) * fVar281 +
        (float)(auVar83._12_4_ >> 0x10)) - fVar317) * fVar234;
  auVar239._0_4_ =
       ((((float)(int)(short)uVar9 - (float)(int)(short)uVar8) * fVar281 + (float)(int)(short)uVar8)
       - fVar312) * fVar168;
  auVar239._4_4_ =
       ((((float)(auVar52._0_4_ >> 0x10) - fVar154) * fVar281 + fVar154) - fVar315) * fVar122;
  auVar239._8_4_ =
       ((((float)(auVar236._8_4_ >> 0x10) - fVar227) * fVar281 + fVar227) - fVar316) * fVar186;
  auVar239._12_4_ =
       ((((float)(auVar237._12_4_ >> 0x10) - (float)(auVar86._12_4_ >> 0x10)) * fVar281 +
        (float)(auVar86._12_4_ >> 0x10)) - fVar317) * fVar234;
  auVar266._0_8_ =
       CONCAT44(((((float)(auVar54._0_4_ >> 0x10) - fVar167) * fVar281 + fVar167) - fVar272) *
                fVar125,((((float)(int)(short)uVar11 - (float)(int)(short)uVar10) * fVar281 +
                         (float)(int)(short)uVar10) - fVar262) * fVar80);
  auVar266._8_4_ =
       ((((float)(auVar263._8_4_ >> 0x10) - fVar228) * fVar281 + fVar228) - fVar273) * fVar203;
  auVar266._12_4_ =
       ((((float)(auVar264._12_4_ >> 0x10) - (float)(auVar89._12_4_ >> 0x10)) * fVar281 +
        (float)(auVar89._12_4_ >> 0x10)) - fVar311) * fVar247;
  auVar278._0_4_ =
       ((((float)(int)(short)uVar12 - (float)(int)(short)uVar72) * fVar281 +
        (float)(int)(short)uVar72) - fVar262) * fVar80;
  auVar278._4_4_ =
       ((((float)(auVar56._0_4_ >> 0x10) - fVar169) * fVar281 + fVar169) - fVar272) * fVar125;
  auVar278._8_4_ =
       ((((float)(auVar275._8_4_ >> 0x10) - fVar229) * fVar281 + fVar229) - fVar273) * fVar203;
  auVar278._12_4_ =
       ((((float)(auVar276._12_4_ >> 0x10) - (float)(auVar92._12_4_ >> 0x10)) * fVar281 +
        (float)(auVar92._12_4_ >> 0x10)) - fVar311) * fVar247;
  auVar288._0_8_ =
       CONCAT44(((((float)(auVar58._0_4_ >> 0x10) - fVar184) * fVar281 + fVar184) - fVar260) *
                fVar152,((((float)(int)(short)uVar14 - (float)(int)(short)uVar13) * fVar281 +
                         (float)(int)(short)uVar13) - fVar249) * fVar120);
  auVar288._8_4_ =
       ((((float)(auVar285._8_4_ >> 0x10) - fVar232) * fVar281 + fVar232) - fVar261) * fVar204;
  auVar288._12_4_ =
       ((((float)(auVar286._12_4_ >> 0x10) - (float)(auVar95._12_4_ >> 0x10)) * fVar281 +
        (float)(auVar95._12_4_ >> 0x10)) - fVar274) * fVar248;
  auVar301._0_4_ =
       ((((float)(int)(short)uVar63 - (float)(int)(short)uVar15) * fVar281 +
        (float)(int)(short)uVar15) - fVar249) * fVar120;
  auVar301._4_4_ =
       ((((float)(auVar60._0_4_ >> 0x10) - fVar185) * fVar281 + fVar185) - fVar260) * fVar152;
  auVar301._8_4_ =
       ((((float)(auVar298._8_4_ >> 0x10) - fVar233) * fVar281 + fVar233) - fVar261) * fVar204;
  auVar301._12_4_ =
       ((((float)(auVar299._12_4_ >> 0x10) - (float)(auVar98._12_4_ >> 0x10)) * fVar281 +
        (float)(auVar98._12_4_ >> 0x10)) - fVar274) * fVar248;
  auVar155._8_4_ = auVar174._8_4_;
  auVar155._0_8_ = auVar174._0_8_;
  auVar155._12_4_ = auVar174._12_4_;
  auVar156 = minps(auVar155,auVar239);
  auVar100._8_4_ = auVar266._8_4_;
  auVar100._0_8_ = auVar266._0_8_;
  auVar100._12_4_ = auVar266._12_4_;
  auVar82 = minps(auVar100,auVar278);
  auVar156 = maxps(auVar156,auVar82);
  auVar101._8_4_ = auVar288._8_4_;
  auVar101._0_8_ = auVar288._0_8_;
  auVar101._12_4_ = auVar288._12_4_;
  auVar82 = minps(auVar101,auVar301);
  uVar67 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar135._4_4_ = uVar67;
  auVar135._0_4_ = uVar67;
  auVar135._8_4_ = uVar67;
  auVar135._12_4_ = uVar67;
  auVar82 = maxps(auVar82,auVar135);
  auVar82 = maxps(auVar156,auVar82);
  auVar156 = maxps(auVar174,auVar239);
  auVar267 = maxps(auVar266,auVar278);
  auVar156 = minps(auVar156,auVar267);
  local_248 = auVar82._0_4_ * 0.99999964;
  fStack_244 = auVar82._4_4_ * 0.99999964;
  fStack_240 = auVar82._8_4_ * 0.99999964;
  fStack_23c = auVar82._12_4_ * 0.99999964;
  auVar82 = maxps(auVar288,auVar301);
  fVar168 = (ray->super_RayK<1>).tfar;
  auVar102._4_4_ = fVar168;
  auVar102._0_4_ = fVar168;
  auVar102._8_4_ = fVar168;
  auVar102._12_4_ = fVar168;
  auVar82 = minps(auVar82,auVar102);
  auVar82 = minps(auVar156,auVar82);
  uVar75 = (uint)(byte)PVar16;
  auVar136._0_4_ = -(uint)(uVar75 != 0 && local_248 <= auVar82._0_4_ * 1.0000004);
  auVar136._4_4_ = -(uint)(1 < uVar75 && fStack_244 <= auVar82._4_4_ * 1.0000004);
  auVar136._8_4_ = -(uint)(2 < uVar75 && fStack_240 <= auVar82._8_4_ * 1.0000004);
  auVar136._12_4_ = -(uint)(3 < uVar75 && fStack_23c <= auVar82._12_4_ * 1.0000004);
  uVar75 = movmskps(uVar75,auVar136);
  if (uVar75 == 0) {
    return;
  }
  uVar75 = uVar75 & 0xff;
  local_218._0_12_ = mm_lookupmask_ps._240_12_;
  local_218._12_4_ = 0;
  local_2b0 = context;
  local_2a8 = prim;
LAB_00bf9d69:
  local_2a0 = (ulong)uVar75;
  lVar73 = 0;
  if (local_2a0 != 0) {
    for (; (uVar75 >> lVar73 & 1) == 0; lVar73 = lVar73 + 1) {
    }
  }
  local_5a0 = (RTCIntersectArguments *)(ulong)*(uint *)(local_2a8 + 2);
  local_510 = (ulong)*(uint *)(local_2a8 + lVar73 * 4 + 6);
  pGVar17 = (context->scene->geometries).items[(long)local_5a0].ptr;
  uVar64 = (ulong)*(uint *)(*(long *)&pGVar17->field_0x58 +
                           local_510 *
                           pGVar17[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  local_508 = pGVar17->fnumTimeSegments;
  fVar168 = (pGVar17->time_range).lower;
  fVar168 = (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar168) /
            ((pGVar17->time_range).upper - fVar168)) * local_508;
  _local_568 = ZEXT416((uint)fVar168);
  fVar168 = floorf(fVar168);
  context = local_2b0;
  if (local_508 + -1.0 <= fVar168) {
    fVar168 = local_508 + -1.0;
  }
  fVar80 = 0.0;
  if (0.0 <= fVar168) {
    fVar80 = fVar168;
  }
  fVar152 = (float)local_568._0_4_ - fVar80;
  fVar125 = 1.0 - fVar152;
  _Var18 = pGVar17[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar71 = (long)(int)fVar80 * 0x38;
  lVar19 = *(long *)(_Var18 + 0x10 + lVar71);
  lVar73 = uVar64 + 1;
  p_Var20 = pGVar17[4].occlusionFilterN;
  pRVar68 = *(RTCIntersectArguments **)(p_Var20 + lVar71);
  lVar70 = *(long *)(p_Var20 + lVar71 + 0x10) * lVar73;
  lVar21 = *(long *)(_Var18 + 0x38 + lVar71);
  lVar22 = *(long *)(_Var18 + 0x48 + lVar71);
  pfVar1 = (float *)(lVar21 + lVar22 * uVar64);
  pfVar2 = (float *)(*(long *)(_Var18 + lVar71) + lVar19 * uVar64);
  local_138 = *pfVar2 * fVar125 + *pfVar1 * fVar152;
  local_148 = pfVar2[1] * fVar125 + pfVar1[1] * fVar152;
  local_158 = pfVar2[2] * fVar125 + pfVar1[2] * fVar152;
  fVar154 = pfVar2[3] * fVar125 + pfVar1[3] * fVar152;
  pfVar1 = (float *)(*(long *)(p_Var20 + lVar71 + 0x38) +
                    uVar64 * *(long *)(p_Var20 + lVar71 + 0x48));
  pRVar3 = (RTCRayQueryFlags *)((long)&pRVar68->flags + *(long *)(p_Var20 + lVar71 + 0x10) * uVar64)
  ;
  pfVar2 = (float *)(lVar21 + lVar22 * lVar73);
  pfVar4 = (float *)(*(long *)(_Var18 + lVar71) + lVar19 * lVar73);
  pfVar5 = (float *)(*(long *)(p_Var20 + lVar71 + 0x38) +
                    *(long *)(p_Var20 + lVar71 + 0x48) * lVar73);
  pRVar6 = (RTCRayQueryFlags *)((long)&pRVar68->flags + lVar70);
  local_478 = *pfVar4 * fVar125 + *pfVar2 * fVar152;
  fStack_474 = pfVar4[1] * fVar125 + pfVar2[1] * fVar152;
  fStack_470 = pfVar4[2] * fVar125 + pfVar2[2] * fVar152;
  fStack_46c = pfVar4[3] * fVar125 + pfVar2[3] * fVar152;
  local_508 = ((float)*pRVar3 * fVar125 + *pfVar1 * fVar152) * 0.33333334 + local_138;
  fStack_504 = ((float)pRVar3[1] * fVar125 + pfVar1[1] * fVar152) * 0.33333334 + local_148;
  fStack_500 = ((float)pRVar3[2] * fVar125 + pfVar1[2] * fVar152) * 0.33333334 + local_158;
  local_488 = local_478 - (fVar125 * (float)*pRVar6 + fVar152 * *pfVar5) * 0.33333334;
  fStack_484 = fStack_474 - (fVar125 * (float)pRVar6[1] + fVar152 * pfVar5[1]) * 0.33333334;
  fStack_480 = fStack_470 - (fVar125 * (float)pRVar6[2] + fVar152 * pfVar5[2]) * 0.33333334;
  fVar168 = (ray->super_RayK<1>).org.field_0.m128[0];
  fVar80 = (ray->super_RayK<1>).org.field_0.m128[1];
  fVar120 = (ray->super_RayK<1>).org.field_0.m128[2];
  local_2f8 = (ray->super_RayK<1>).dir.field_0.m128[0];
  local_3f8 = (ray->super_RayK<1>).dir.field_0.m128[1];
  local_348 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fVar122 = (ray->super_RayK<1>).dir.field_0.m128[3];
  fStack_11c = local_2f8 * local_2f8;
  fVar167 = local_3f8 * local_3f8;
  fVar169 = local_348 * local_348;
  fVar122 = fVar122 * fVar122;
  fVar153 = fStack_11c + fVar167 + fVar169;
  auVar187._0_8_ = CONCAT44(fVar167 + fVar167 + fVar122,fVar153);
  auVar187._8_4_ = fVar169 + fVar167 + fVar169;
  auVar187._12_4_ = fVar122 + fVar167 + fVar122;
  auVar175._8_4_ = auVar187._8_4_;
  auVar175._0_8_ = auVar187._0_8_;
  auVar175._12_4_ = auVar187._12_4_;
  auVar82 = rcpss(auVar175,auVar187);
  local_3c8 = (2.0 - fVar153 * auVar82._0_4_) * auVar82._0_4_ *
              (((local_158 + fStack_500 + fStack_480 + fStack_470) * 0.25 - fVar120) * local_348 +
              ((local_148 + fStack_504 + fStack_484 + fStack_474) * 0.25 - fVar80) * local_3f8 +
              ((local_138 + local_508 + local_488 + local_478) * 0.25 - fVar168) * local_2f8);
  local_2e8 = ZEXT416((uint)local_3c8);
  fStack_3c4 = local_3c8;
  fStack_3c0 = local_3c8;
  fStack_3bc = local_3c8;
  fVar168 = local_2f8 * local_3c8 + fVar168;
  fVar80 = local_3f8 * local_3c8 + fVar80;
  fVar120 = local_348 * local_3c8 + fVar120;
  local_138 = local_138 - fVar168;
  local_148 = local_148 - fVar80;
  local_158 = local_158 - fVar120;
  fStack_55c = fVar154 - 0.0;
  local_488 = local_488 - fVar168;
  fStack_484 = fStack_484 - fVar80;
  fStack_480 = fStack_480 - fVar120;
  fStack_47c = (fStack_46c - (fVar125 * (float)pRVar6[3] + fVar152 * pfVar5[3]) * 0.33333334) - 0.0;
  local_508 = local_508 - fVar168;
  fStack_504 = fStack_504 - fVar80;
  fStack_500 = fStack_500 - fVar120;
  fStack_4fc = (((float)pRVar3[3] * fVar125 + pfVar1[3] * fVar152) * 0.33333334 + fVar154) - 0.0;
  local_478 = local_478 - fVar168;
  fStack_474 = fStack_474 - fVar80;
  fStack_470 = fStack_470 - fVar120;
  fStack_46c = fStack_46c - 0.0;
  fStack_134 = local_138;
  fStack_130 = local_138;
  fStack_12c = local_138;
  fStack_144 = local_148;
  fStack_140 = local_148;
  fStack_13c = local_148;
  fStack_154 = local_158;
  fStack_150 = local_158;
  fStack_14c = local_158;
  local_568._4_4_ = local_148;
  local_568._0_4_ = local_138;
  fStack_560 = local_158;
  local_168 = fStack_55c;
  fStack_164 = fStack_55c;
  fStack_160 = fStack_55c;
  fStack_15c = fStack_55c;
  local_178 = local_508;
  fStack_174 = local_508;
  fStack_170 = local_508;
  fStack_16c = local_508;
  local_188 = fStack_504;
  fStack_184 = fStack_504;
  fStack_180 = fStack_504;
  fStack_17c = fStack_504;
  local_198 = fStack_500;
  fStack_194 = fStack_500;
  fStack_190 = fStack_500;
  fStack_18c = fStack_500;
  local_128 = fStack_11c + fVar169 + fVar167;
  fStack_124 = fStack_11c + fVar169 + fVar167;
  fStack_120 = fStack_11c + fVar169 + fVar167;
  fStack_11c = fStack_11c + fVar169 + fVar167;
  local_1a8 = fStack_4fc;
  fStack_1a4 = fStack_4fc;
  fStack_1a0 = fStack_4fc;
  fStack_19c = fStack_4fc;
  local_1b8 = local_488;
  fStack_1b4 = local_488;
  fStack_1b0 = local_488;
  fStack_1ac = local_488;
  local_1c8 = fStack_484;
  fStack_1c4 = fStack_484;
  fStack_1c0 = fStack_484;
  fStack_1bc = fStack_484;
  local_278 = fStack_480;
  fStack_274 = fStack_480;
  fStack_270 = fStack_480;
  fStack_26c = fStack_480;
  local_288 = fStack_47c;
  fStack_284 = fStack_47c;
  fStack_280 = fStack_47c;
  fStack_27c = fStack_47c;
  local_1d8 = local_478;
  fStack_1d4 = local_478;
  fStack_1d0 = local_478;
  fStack_1cc = local_478;
  local_1e8 = fStack_474;
  fStack_1e4 = fStack_474;
  fStack_1e0 = fStack_474;
  fStack_1dc = fStack_474;
  local_1f8 = fStack_470;
  fStack_1f4 = fStack_470;
  fStack_1f0 = fStack_470;
  fStack_1ec = fStack_470;
  local_208 = fStack_46c;
  fStack_204 = fStack_46c;
  fStack_200 = fStack_46c;
  fStack_1fc = fStack_46c;
  fStack_2f4 = local_2f8;
  fStack_2f0 = local_2f8;
  fStack_2ec = local_2f8;
  fStack_3f4 = local_3f8;
  fStack_3f0 = local_3f8;
  fStack_3ec = local_3f8;
  fStack_344 = local_348;
  fStack_340 = local_348;
  fStack_33c = local_348;
  local_298 = ABS(local_128);
  fStack_294 = ABS(fStack_124);
  fStack_290 = ABS(fStack_120);
  fStack_28c = ABS(fStack_11c);
  uVar64 = 1;
  local_4a0 = 1;
  fVar168 = 0.0;
  fVar80 = 1.0;
  uVar67 = 0;
  uVar62 = 0;
  uVar69 = 0;
  do {
    local_398 = fVar80 - fVar168;
    local_408 = fVar168;
    fStack_404 = fVar80;
    uStack_400 = uVar67;
    uStack_3fc = uVar62;
    fStack_394 = local_398;
    fStack_390 = local_398;
    fStack_38c = local_398;
    local_3a8 = fVar168;
    fStack_3a4 = fVar168;
    fStack_3a0 = fVar168;
    fStack_39c = fVar168;
    fVar120 = local_398 * 0.0 + fVar168;
    fVar122 = local_398 * 0.33333334 + fVar168;
    fVar125 = local_398 * 0.6666667 + fVar168;
    fVar152 = local_398 * 1.0 + fVar168;
    fVar261 = (float)DAT_01feca10;
    fVar274 = fVar261 - fVar120;
    fVar281 = DAT_01feca10._4_4_;
    fVar282 = fVar281 - fVar122;
    fVar283 = DAT_01feca10._8_4_;
    fVar294 = DAT_01feca10._12_4_;
    fVar292 = fVar283 - fVar125;
    fVar293 = fVar294 - fVar152;
    fVar153 = local_178 * fVar274 + local_1b8 * fVar120;
    fVar305 = fStack_174 * fVar282 + fStack_1b4 * fVar122;
    fVar307 = fStack_170 * fVar292 + fStack_1b0 * fVar125;
    fVar309 = fStack_16c * fVar293 + fStack_1ac * fVar152;
    fVar312 = local_188 * fVar274 + local_1c8 * fVar120;
    fVar315 = fStack_184 * fVar282 + fStack_1c4 * fVar122;
    fVar316 = fStack_180 * fVar292 + fStack_1c0 * fVar125;
    fVar317 = fStack_17c * fVar293 + fStack_1bc * fVar152;
    fVar80 = local_198 * fVar274 + local_278 * fVar120;
    fVar154 = fStack_194 * fVar282 + fStack_274 * fVar122;
    fVar167 = fStack_190 * fVar292 + fStack_270 * fVar125;
    fVar169 = fStack_18c * fVar293 + fStack_26c * fVar152;
    fVar273 = local_1a8 * fVar274 + local_288 * fVar120;
    fVar311 = fStack_1a4 * fVar282 + fStack_284 * fVar122;
    fVar249 = fStack_1a0 * fVar292 + fStack_280 * fVar125;
    fVar260 = fStack_19c * fVar293 + fStack_27c * fVar152;
    fVar184 = (local_138 * fVar274 + local_178 * fVar120) * fVar274 + fVar120 * fVar153;
    fVar185 = (fStack_134 * fVar282 + fStack_174 * fVar122) * fVar282 + fVar122 * fVar305;
    fVar186 = (fStack_130 * fVar292 + fStack_170 * fVar125) * fVar292 + fVar125 * fVar307;
    fVar203 = (fStack_12c * fVar293 + fStack_16c * fVar152) * fVar293 + fVar152 * fVar309;
    fVar204 = (local_148 * fVar274 + local_188 * fVar120) * fVar274 + fVar120 * fVar312;
    fVar205 = (fStack_144 * fVar282 + fStack_184 * fVar122) * fVar282 + fVar122 * fVar315;
    fVar227 = (fStack_140 * fVar292 + fStack_180 * fVar125) * fVar292 + fVar125 * fVar316;
    fVar228 = (fStack_13c * fVar293 + fStack_17c * fVar152) * fVar293 + fVar152 * fVar317;
    fVar229 = (local_158 * fVar274 + local_198 * fVar120) * fVar274 + fVar120 * fVar80;
    fVar232 = (fStack_154 * fVar282 + fStack_194 * fVar122) * fVar282 + fVar122 * fVar154;
    fVar233 = (fStack_150 * fVar292 + fStack_190 * fVar125) * fVar292 + fVar125 * fVar167;
    fVar234 = (fStack_14c * fVar293 + fStack_18c * fVar152) * fVar293 + fVar152 * fVar169;
    fVar247 = (local_168 * fVar274 + local_1a8 * fVar120) * fVar274 + fVar120 * fVar273;
    fVar248 = (fStack_164 * fVar282 + fStack_1a4 * fVar122) * fVar282 + fVar122 * fVar311;
    fVar262 = (fStack_160 * fVar292 + fStack_1a0 * fVar125) * fVar292 + fVar125 * fVar249;
    fVar272 = (fStack_15c * fVar293 + fStack_19c * fVar152) * fVar293 + fVar152 * fVar260;
    fVar295 = fVar153 * fVar274 + (local_1b8 * fVar274 + local_1d8 * fVar120) * fVar120;
    fVar305 = fVar305 * fVar282 + (fStack_1b4 * fVar282 + fStack_1d4 * fVar122) * fVar122;
    fVar307 = fVar307 * fVar292 + (fStack_1b0 * fVar292 + fStack_1d0 * fVar125) * fVar125;
    fVar309 = fVar309 * fVar293 + (fStack_1ac * fVar293 + fStack_1cc * fVar152) * fVar152;
    fVar312 = fVar312 * fVar274 + (local_1c8 * fVar274 + local_1e8 * fVar120) * fVar120;
    fVar315 = fVar315 * fVar282 + (fStack_1c4 * fVar282 + fStack_1e4 * fVar122) * fVar122;
    fVar316 = fVar316 * fVar292 + (fStack_1c0 * fVar292 + fStack_1e0 * fVar125) * fVar125;
    fVar317 = fVar317 * fVar293 + (fStack_1bc * fVar293 + fStack_1dc * fVar152) * fVar152;
    fVar153 = fVar80 * fVar274 + (local_278 * fVar274 + local_1f8 * fVar120) * fVar120;
    fVar154 = fVar154 * fVar282 + (fStack_274 * fVar282 + fStack_1f4 * fVar122) * fVar122;
    fVar167 = fVar167 * fVar292 + (fStack_270 * fVar292 + fStack_1f0 * fVar125) * fVar125;
    fVar169 = fVar169 * fVar293 + (fStack_26c * fVar293 + fStack_1ec * fVar152) * fVar152;
    fVar273 = fVar273 * fVar274 + (local_288 * fVar274 + local_208 * fVar120) * fVar120;
    fVar311 = fVar311 * fVar282 + (fStack_284 * fVar282 + fStack_204 * fVar122) * fVar122;
    fVar249 = fVar249 * fVar292 + (fStack_280 * fVar292 + fStack_200 * fVar125) * fVar125;
    fVar260 = fVar260 * fVar293 + (fStack_27c * fVar293 + fStack_1fc * fVar152) * fVar152;
    local_578._0_4_ = fVar274 * fVar184 + fVar120 * fVar295;
    local_578._4_4_ = fVar282 * fVar185 + fVar122 * fVar305;
    fStack_570 = fVar292 * fVar186 + fVar125 * fVar307;
    fStack_56c = fVar293 * fVar203 + fVar152 * fVar309;
    fVar318 = fVar274 * fVar204 + fVar120 * fVar312;
    fVar321 = fVar282 * fVar205 + fVar122 * fVar315;
    fVar322 = fVar292 * fVar227 + fVar125 * fVar316;
    fVar323 = fVar293 * fVar228 + fVar152 * fVar317;
    fVar296 = fVar274 * fVar229 + fVar120 * fVar153;
    fVar306 = fVar282 * fVar232 + fVar122 * fVar154;
    fVar308 = fVar292 * fVar233 + fVar125 * fVar167;
    fVar310 = fVar293 * fVar234 + fVar152 * fVar169;
    fVar80 = local_398 * 0.11111111;
    fVar274 = fVar274 * fVar247 + fVar120 * fVar273;
    fVar282 = fVar282 * fVar248 + fVar122 * fVar311;
    auVar268._0_8_ = CONCAT44(fVar282,fVar274);
    auVar268._8_4_ = fVar292 * fVar262 + fVar125 * fVar249;
    auVar268._12_4_ = fVar293 * fVar272 + fVar152 * fVar260;
    local_528._0_4_ = (fVar295 - fVar184) * 3.0 * fVar80;
    local_538 = (fVar305 - fVar185) * 3.0 * fVar80;
    fStack_534 = (fVar307 - fVar186) * 3.0 * fVar80;
    fStack_530 = (fVar309 - fVar203) * 3.0 * fVar80;
    local_588 = (fVar312 - fVar204) * 3.0 * fVar80;
    local_548 = (fVar315 - fVar205) * 3.0 * fVar80;
    fStack_544 = (fVar316 - fVar227) * 3.0 * fVar80;
    fStack_540 = (fVar317 - fVar228) * 3.0 * fVar80;
    local_4b8 = (fVar153 - fVar229) * 3.0 * fVar80;
    local_558 = (fVar154 - fVar232) * 3.0 * fVar80;
    fStack_554 = (fVar167 - fVar233) * 3.0 * fVar80;
    fStack_550 = (fVar169 - fVar234) * 3.0 * fVar80;
    fVar120 = fVar80 * (fVar311 - fVar248) * 3.0;
    fVar122 = fVar80 * (fVar249 - fVar262) * 3.0;
    fVar125 = fVar80 * (fVar260 - fVar272) * 3.0;
    local_598._4_4_ = fStack_570;
    local_598._0_4_ = local_578._4_4_;
    fStack_590 = fStack_56c;
    fStack_58c = 0.0;
    local_5b8._4_4_ = fVar308;
    local_5b8._0_4_ = fVar306;
    local_5b8._8_4_ = fVar310;
    local_5b8._12_4_ = 0;
    auVar188._4_4_ = auVar268._8_4_;
    auVar188._0_4_ = fVar282;
    auVar188._8_4_ = auVar268._12_4_;
    auVar188._12_4_ = 0;
    local_5f8._4_4_ = fVar282 + fVar120;
    local_5f8._0_4_ = fVar274 + fVar80 * (fVar273 - fVar247) * 3.0;
    fStack_5f0 = auVar268._8_4_ + fVar122;
    fStack_5ec = auVar268._12_4_ + fVar125;
    auVar137._0_8_ = CONCAT44(auVar268._8_4_ - fVar122,fVar282 - fVar120);
    auVar137._8_4_ = auVar268._12_4_ - fVar125;
    auVar137._12_4_ = 0;
    local_368._4_4_ = fVar322;
    local_368._0_4_ = fVar321;
    fStack_360 = fVar323;
    fStack_35c = 0.0;
    local_3e8 = fVar321 - fVar318;
    fStack_3e4 = fVar322 - fVar321;
    fStack_3e0 = fVar323 - fVar322;
    fStack_3dc = 0.0 - fVar323;
    local_418._0_4_ = fVar306 - fVar296;
    local_418._4_4_ = fVar308 - fVar306;
    fStack_410 = fVar310 - fVar308;
    fStack_40c = 0.0 - fVar310;
    fVar80 = local_588 * (float)local_418._0_4_ - local_4b8 * local_3e8;
    fVar120 = local_548 * (float)local_418._4_4_ - local_558 * fStack_3e4;
    fVar122 = fStack_544 * fStack_410 - fStack_554 * fStack_3e0;
    fVar125 = fStack_540 * fStack_40c - fStack_550 * fStack_3dc;
    local_428._0_4_ = (float)local_578._4_4_ - (float)local_578._0_4_;
    local_428._4_4_ = fStack_570 - (float)local_578._4_4_;
    fStack_420 = fStack_56c - fStack_570;
    fStack_41c = 0.0 - fStack_56c;
    fVar152 = local_4b8 * (float)local_428._0_4_ - (float)local_528._0_4_ * (float)local_418._0_4_;
    fVar154 = local_558 * (float)local_428._4_4_ - local_538 * (float)local_418._4_4_;
    fVar169 = fStack_554 * fStack_420 - fStack_534 * fStack_410;
    fVar185 = fStack_550 * fStack_41c - fStack_530 * fStack_40c;
    fVar153 = (float)local_528._0_4_ * local_3e8 - local_588 * (float)local_428._0_4_;
    fVar167 = local_538 * fStack_3e4 - local_548 * (float)local_428._4_4_;
    fVar184 = fStack_534 * fStack_3e0 - fStack_544 * fStack_420;
    fVar186 = fStack_530 * fStack_3dc - fStack_540 * fStack_41c;
    auVar240._0_4_ = fVar153 * fVar153;
    auVar240._4_4_ = fVar167 * fVar167;
    auVar240._8_4_ = fVar184 * fVar184;
    auVar240._12_4_ = fVar186 * fVar186;
    auVar176._0_4_ =
         (float)local_428._0_4_ * (float)local_428._0_4_ +
         local_3e8 * local_3e8 + (float)local_418._0_4_ * (float)local_418._0_4_;
    auVar176._4_4_ =
         (float)local_428._4_4_ * (float)local_428._4_4_ +
         fStack_3e4 * fStack_3e4 + (float)local_418._4_4_ * (float)local_418._4_4_;
    auVar176._8_4_ = fStack_420 * fStack_420 + fStack_3e0 * fStack_3e0 + fStack_410 * fStack_410;
    auVar176._12_4_ = fStack_41c * fStack_41c + fStack_3dc * fStack_3dc + fStack_40c * fStack_40c;
    auVar82 = rcpps(auVar240,auVar176);
    fVar153 = auVar82._0_4_;
    fVar167 = auVar82._4_4_;
    fVar184 = auVar82._8_4_;
    fVar186 = auVar82._12_4_;
    fVar153 = (1.0 - fVar153 * auVar176._0_4_) * fVar153 + fVar153;
    fVar167 = (1.0 - fVar167 * auVar176._4_4_) * fVar167 + fVar167;
    fVar184 = (1.0 - fVar184 * auVar176._8_4_) * fVar184 + fVar184;
    fVar186 = (1.0 - fVar186 * auVar176._12_4_) * fVar186 + fVar186;
    fVar203 = (float)local_418._0_4_ * local_548 - local_3e8 * local_558;
    fVar204 = (float)local_418._4_4_ * fStack_544 - fStack_3e4 * fStack_554;
    fVar205 = fStack_410 * fStack_540 - fStack_3e0 * fStack_550;
    fVar227 = fStack_40c * 0.0 - fStack_3dc * 0.0;
    local_528._4_4_ = local_538;
    fStack_520 = fStack_534;
    fStack_51c = fStack_530;
    fStack_54c = 0.0;
    fVar228 = (float)local_428._0_4_ * local_558 - (float)local_418._0_4_ * local_538;
    fVar229 = (float)local_428._4_4_ * fStack_554 - (float)local_418._4_4_ * fStack_534;
    fVar232 = fStack_420 * fStack_550 - fStack_410 * fStack_530;
    fVar233 = fStack_41c * 0.0 - fStack_40c * 0.0;
    fStack_53c = 0.0;
    fStack_52c = 0.0;
    fVar234 = local_3e8 * local_538 - (float)local_428._0_4_ * local_548;
    fVar247 = fStack_3e4 * fStack_534 - (float)local_428._4_4_ * fStack_544;
    fVar248 = fStack_3e0 * fStack_530 - fStack_420 * fStack_540;
    fVar262 = fStack_3dc * 0.0 - fStack_41c * 0.0;
    auVar313._0_4_ = fVar234 * fVar234;
    auVar313._4_4_ = fVar247 * fVar247;
    auVar313._8_4_ = fVar248 * fVar248;
    auVar313._12_4_ = fVar262 * fVar262;
    auVar103._0_4_ = (fVar80 * fVar80 + fVar152 * fVar152 + auVar240._0_4_) * fVar153;
    auVar103._4_4_ = (fVar120 * fVar120 + fVar154 * fVar154 + auVar240._4_4_) * fVar167;
    auVar103._8_4_ = (fVar122 * fVar122 + fVar169 * fVar169 + auVar240._8_4_) * fVar184;
    auVar103._12_4_ = (fVar125 * fVar125 + fVar185 * fVar185 + auVar240._12_4_) * fVar186;
    auVar250._0_4_ = (fVar203 * fVar203 + fVar228 * fVar228 + auVar313._0_4_) * fVar153;
    auVar250._4_4_ = (fVar204 * fVar204 + fVar229 * fVar229 + auVar313._4_4_) * fVar167;
    auVar250._8_4_ = (fVar205 * fVar205 + fVar232 * fVar232 + auVar313._8_4_) * fVar184;
    auVar250._12_4_ = (fVar227 * fVar227 + fVar233 * fVar233 + auVar313._12_4_) * fVar186;
    auVar82 = maxps(auVar103,auVar250);
    auVar241._8_4_ = auVar268._8_4_;
    auVar241._0_8_ = auVar268._0_8_;
    auVar241._12_4_ = auVar268._12_4_;
    auVar267 = maxps(auVar241,_local_5f8);
    auVar222._8_4_ = auVar137._8_4_;
    auVar222._0_8_ = auVar137._0_8_;
    auVar222._12_4_ = 0;
    auVar156 = maxps(auVar222,auVar188);
    auVar267 = maxps(auVar267,auVar156);
    auVar269 = minps(auVar268,_local_5f8);
    auVar156 = minps(auVar137,auVar188);
    auVar156 = minps(auVar269,auVar156);
    auVar82 = sqrtps(auVar82,auVar82);
    auVar269 = rsqrtps(auVar313,auVar176);
    fVar80 = auVar269._0_4_;
    fVar120 = auVar269._4_4_;
    fVar122 = auVar269._8_4_;
    fVar125 = auVar269._12_4_;
    fVar272 = fVar80 * fVar80 * auVar176._0_4_ * -0.5 * fVar80 + fVar80 * 1.5;
    fVar273 = fVar120 * fVar120 * auVar176._4_4_ * -0.5 * fVar120 + fVar120 * 1.5;
    fVar311 = fVar122 * fVar122 * auVar176._8_4_ * -0.5 * fVar122 + fVar122 * 1.5;
    fVar249 = fVar125 * fVar125 * auVar176._12_4_ * -0.5 * fVar125 + fVar125 * 1.5;
    local_378 = 0.0 - fVar318;
    fStack_374 = 0.0 - fVar321;
    fStack_370 = 0.0 - fVar322;
    fStack_36c = 0.0 - fVar323;
    local_388 = 0.0 - fVar296;
    fStack_384 = 0.0 - fVar306;
    fStack_380 = 0.0 - fVar308;
    fStack_37c = 0.0 - fVar310;
    fVar203 = 0.0 - (float)local_578._0_4_;
    fVar205 = 0.0 - (float)local_578._4_4_;
    fVar228 = 0.0 - fStack_570;
    fVar232 = 0.0 - fStack_56c;
    auVar223._0_4_ = local_3f8 * local_3e8 * fVar272 + local_348 * (float)local_418._0_4_ * fVar272;
    auVar223._4_4_ =
         fStack_3f4 * fStack_3e4 * fVar273 + fStack_344 * (float)local_418._4_4_ * fVar273;
    auVar223._8_4_ = fStack_3f0 * fStack_3e0 * fVar311 + fStack_340 * fStack_410 * fVar311;
    auVar223._12_4_ = fStack_3ec * fStack_3dc * fVar249 + fStack_33c * fStack_40c * fVar249;
    auVar189._8_4_ = fVar311;
    auVar189._0_8_ = CONCAT44(fVar273,fVar272);
    auVar189._12_4_ = fVar249;
    local_308._0_4_ = local_2f8 * (float)local_428._0_4_ * fVar272 + auVar223._0_4_;
    local_308._4_4_ = fStack_2f4 * (float)local_428._4_4_ * fVar273 + auVar223._4_4_;
    fStack_300 = fStack_2f0 * fStack_420 * fVar311 + auVar223._8_4_;
    fStack_2fc = fStack_2ec * fStack_41c * fVar249 + auVar223._12_4_;
    local_318._0_4_ =
         (float)local_428._0_4_ * fVar272 * fVar203 +
         local_3e8 * fVar272 * local_378 + (float)local_418._0_4_ * fVar272 * local_388;
    local_318._4_4_ =
         (float)local_428._4_4_ * fVar273 * fVar205 +
         fStack_3e4 * fVar273 * fStack_374 + (float)local_418._4_4_ * fVar273 * fStack_384;
    fStack_310 = fStack_420 * fVar311 * fVar228 +
                 fStack_3e0 * fVar311 * fStack_370 + fStack_410 * fVar311 * fStack_380;
    fStack_30c = fStack_41c * fVar249 * fVar232 +
                 fStack_3dc * fVar249 * fStack_36c + fStack_40c * fVar249 * fStack_37c;
    fVar169 = (local_2f8 * fVar203 + local_3f8 * local_378 + local_348 * local_388) -
              (float)local_308._0_4_ * (float)local_318._0_4_;
    fVar184 = (fStack_2f4 * fVar205 + fStack_3f4 * fStack_374 + fStack_344 * fStack_384) -
              (float)local_308._4_4_ * (float)local_318._4_4_;
    fVar185 = (fStack_2f0 * fVar228 + fStack_3f0 * fStack_370 + fStack_340 * fStack_380) -
              fStack_300 * fStack_310;
    fVar186 = (fStack_2ec * fVar232 + fStack_3ec * fStack_36c + fStack_33c * fStack_37c) -
              fStack_2fc * fStack_30c;
    fVar234 = (fVar203 * fVar203 + local_378 * local_378 + local_388 * local_388) -
              (float)local_318._0_4_ * (float)local_318._0_4_;
    fVar247 = (fVar205 * fVar205 + fStack_374 * fStack_374 + fStack_384 * fStack_384) -
              (float)local_318._4_4_ * (float)local_318._4_4_;
    fVar248 = (fVar228 * fVar228 + fStack_370 * fStack_370 + fStack_380 * fStack_380) -
              fStack_310 * fStack_310;
    fVar262 = (fVar232 * fVar232 + fStack_36c * fStack_36c + fStack_37c * fStack_37c) -
              fStack_30c * fStack_30c;
    fVar80 = (auVar267._0_4_ + auVar82._0_4_) * 1.0000002;
    fVar120 = (auVar267._4_4_ + auVar82._4_4_) * 1.0000002;
    fVar122 = (auVar267._8_4_ + auVar82._8_4_) * 1.0000002;
    fVar125 = (auVar267._12_4_ + auVar82._12_4_) * 1.0000002;
    fVar204 = fVar234 - fVar80 * fVar80;
    fVar227 = fVar247 - fVar120 * fVar120;
    fVar229 = fVar248 - fVar122 * fVar122;
    fVar233 = fVar262 - fVar125 * fVar125;
    fVar152 = (float)local_308._0_4_ * (float)local_308._0_4_;
    fVar153 = (float)local_308._4_4_ * (float)local_308._4_4_;
    fVar154 = fStack_300 * fStack_300;
    fVar167 = fStack_2fc * fStack_2fc;
    fVar260 = local_128 - fVar152;
    fVar274 = fStack_124 - fVar153;
    fVar282 = fStack_120 - fVar154;
    fVar292 = fStack_11c - fVar167;
    local_498._0_4_ = fVar169 + fVar169;
    local_498._4_4_ = fVar184 + fVar184;
    fStack_490 = fVar185 + fVar185;
    fStack_48c = fVar186 + fVar186;
    local_3b8._0_4_ = (float)local_498._0_4_ * (float)local_498._0_4_;
    local_3b8._4_4_ = (float)local_498._4_4_ * (float)local_498._4_4_;
    fStack_3b0 = fStack_490 * fStack_490;
    fStack_3ac = fStack_48c * fStack_48c;
    fVar80 = fVar260 * 4.0;
    fVar120 = fVar274 * 4.0;
    fVar122 = fVar282 * 4.0;
    fVar125 = fVar292 * 4.0;
    auVar242._0_4_ = (float)local_3b8._0_4_ - fVar80 * fVar204;
    auVar242._4_4_ = (float)local_3b8._4_4_ - fVar120 * fVar227;
    auVar242._8_4_ = fStack_3b0 - fVar122 * fVar229;
    auVar242._12_4_ = fStack_3ac - fVar125 * fVar233;
    local_5f8._4_4_ = (auVar156._4_4_ - auVar82._4_4_) * 0.99999976;
    local_5f8._0_4_ = (auVar156._0_4_ - auVar82._0_4_) * 0.99999976;
    fStack_5f0 = (auVar156._8_4_ - auVar82._8_4_) * 0.99999976;
    fStack_5ec = (auVar156._12_4_ - auVar82._12_4_) * 0.99999976;
    auVar289._4_4_ = -(uint)(0.0 <= auVar242._4_4_);
    auVar289._0_4_ = -(uint)(0.0 <= auVar242._0_4_);
    auVar289._8_4_ = -(uint)(0.0 <= auVar242._8_4_);
    auVar289._12_4_ = -(uint)(0.0 <= auVar242._12_4_);
    uVar67 = 0;
    iVar61 = movmskps((int)uVar64,auVar289);
    if (iVar61 == 0) {
      iVar61 = 0;
      auVar139 = _DAT_01feb9f0;
      auVar225 = _DAT_01feba00;
    }
    else {
      auVar156 = sqrtps(_local_498,auVar242);
      bVar23 = 0.0 <= auVar242._0_4_;
      uVar75 = -(uint)bVar23;
      bVar74 = 0.0 <= auVar242._4_4_;
      uVar76 = -(uint)bVar74;
      bVar24 = 0.0 <= auVar242._8_4_;
      uVar77 = -(uint)bVar24;
      bVar25 = 0.0 <= auVar242._12_4_;
      uVar78 = -(uint)bVar25;
      auVar138._0_4_ = fVar260 + fVar260;
      auVar138._4_4_ = fVar274 + fVar274;
      auVar138._8_4_ = fVar282 + fVar282;
      auVar138._12_4_ = fVar292 + fVar292;
      auVar82 = rcpps(auVar223,auVar138);
      fVar169 = auVar82._0_4_;
      fVar185 = auVar82._4_4_;
      fVar293 = auVar82._8_4_;
      fVar305 = auVar82._12_4_;
      fVar169 = (1.0 - auVar138._0_4_ * fVar169) * fVar169 + fVar169;
      fVar185 = (1.0 - auVar138._4_4_ * fVar185) * fVar185 + fVar185;
      fVar293 = (1.0 - auVar138._8_4_ * fVar293) * fVar293 + fVar293;
      fVar305 = (1.0 - auVar138._12_4_ * fVar305) * fVar305 + fVar305;
      fVar184 = (-(float)local_498._0_4_ - auVar156._0_4_) * fVar169;
      fVar186 = (-(float)local_498._4_4_ - auVar156._4_4_) * fVar185;
      fVar295 = (-fStack_490 - auVar156._8_4_) * fVar293;
      fVar307 = (-fStack_48c - auVar156._12_4_) * fVar305;
      fVar169 = (auVar156._0_4_ - (float)local_498._0_4_) * fVar169;
      fVar185 = (auVar156._4_4_ - (float)local_498._4_4_) * fVar185;
      fVar293 = (auVar156._8_4_ - fStack_490) * fVar293;
      fVar305 = (auVar156._12_4_ - fStack_48c) * fVar305;
      local_2c8[0] = ((float)local_308._0_4_ * fVar184 + (float)local_318._0_4_) * fVar272;
      local_2c8[1] = ((float)local_308._4_4_ * fVar186 + (float)local_318._4_4_) * fVar273;
      local_2c8[2] = (fStack_300 * fVar295 + fStack_310) * fVar311;
      local_2c8[3] = (fStack_2fc * fVar307 + fStack_30c) * fVar249;
      local_2d8[0] = ((float)local_308._0_4_ * fVar169 + (float)local_318._0_4_) * fVar272;
      local_2d8[1] = ((float)local_308._4_4_ * fVar185 + (float)local_318._4_4_) * fVar273;
      local_2d8[2] = (fStack_300 * fVar293 + fStack_310) * fVar311;
      local_2d8[3] = (fStack_2fc * fVar305 + fStack_30c) * fVar249;
      auVar224._0_4_ = (uint)fVar184 & uVar75;
      auVar224._4_4_ = (uint)fVar186 & uVar76;
      auVar224._8_4_ = (uint)fVar295 & uVar77;
      auVar224._12_4_ = (uint)fVar307 & uVar78;
      auVar139._0_8_ = CONCAT44(~uVar76,~uVar75) & 0x7f8000007f800000;
      auVar139._8_4_ = ~uVar77 & 0x7f800000;
      auVar139._12_4_ = ~uVar78 & 0x7f800000;
      auVar139 = auVar139 | auVar224;
      auVar251._0_4_ = (uint)fVar169 & uVar75;
      auVar251._4_4_ = (uint)fVar185 & uVar76;
      auVar251._8_4_ = (uint)fVar293 & uVar77;
      auVar251._12_4_ = (uint)fVar305 & uVar78;
      auVar225._0_8_ = CONCAT44(~uVar76,~uVar75) & 0xff800000ff800000;
      auVar225._8_4_ = ~uVar77 & 0xff800000;
      auVar225._12_4_ = ~uVar78 & 0xff800000;
      auVar225 = auVar225 | auVar251;
      auVar252._0_8_ = CONCAT44(fVar153,fVar152) & 0x7fffffff7fffffff;
      auVar252._8_4_ = ABS(fVar154);
      auVar252._12_4_ = ABS(fVar167);
      auVar37._4_4_ = fStack_294;
      auVar37._0_4_ = local_298;
      auVar37._8_4_ = fStack_290;
      auVar37._12_4_ = fStack_28c;
      auVar82 = maxps(auVar37,auVar252);
      fVar169 = auVar82._0_4_ * 1.9073486e-06;
      fVar184 = auVar82._4_4_ * 1.9073486e-06;
      fVar185 = auVar82._8_4_ * 1.9073486e-06;
      fVar186 = auVar82._12_4_ * 1.9073486e-06;
      auVar253._0_4_ = -(uint)(ABS(fVar260) < fVar169 && bVar23);
      auVar253._4_4_ = -(uint)(ABS(fVar274) < fVar184 && bVar74);
      auVar253._8_4_ = -(uint)(ABS(fVar282) < fVar185 && bVar24);
      auVar253._12_4_ = -(uint)(ABS(fVar292) < fVar186 && bVar25);
      iVar61 = movmskps(iVar61,auVar253);
      if (iVar61 != 0) {
        uVar75 = -(uint)(fVar204 <= 0.0);
        uVar76 = -(uint)(fVar227 <= 0.0);
        uVar77 = -(uint)(fVar229 <= 0.0);
        uVar78 = -(uint)(fVar233 <= 0.0);
        auVar314._0_4_ = (uVar75 & 0xff800000 | ~uVar75 & 0x7f800000) & auVar253._0_4_;
        auVar314._4_4_ = (uVar76 & 0xff800000 | ~uVar76 & 0x7f800000) & auVar253._4_4_;
        auVar314._8_4_ = (uVar77 & 0xff800000 | ~uVar77 & 0x7f800000) & auVar253._8_4_;
        auVar314._12_4_ = (uVar78 & 0xff800000 | ~uVar78 & 0x7f800000) & auVar253._12_4_;
        auVar200._0_4_ = ~auVar253._0_4_ & auVar139._0_4_;
        auVar200._4_4_ = ~auVar253._4_4_ & auVar139._4_4_;
        auVar200._8_4_ = ~auVar253._8_4_ & auVar139._8_4_;
        auVar200._12_4_ = ~auVar253._12_4_ & auVar139._12_4_;
        auVar139 = auVar200 | auVar314;
        auVar201._0_4_ = (uVar75 & 0x7f800000 | ~uVar75 & 0xff800000) & auVar253._0_4_;
        auVar201._4_4_ = (uVar76 & 0x7f800000 | ~uVar76 & 0xff800000) & auVar253._4_4_;
        auVar201._8_4_ = (uVar77 & 0x7f800000 | ~uVar77 & 0xff800000) & auVar253._8_4_;
        auVar201._12_4_ = (uVar78 & 0x7f800000 | ~uVar78 & 0xff800000) & auVar253._12_4_;
        auVar259._0_4_ = ~auVar253._0_4_ & auVar225._0_4_;
        auVar259._4_4_ = ~auVar253._4_4_ & auVar225._4_4_;
        auVar259._8_4_ = ~auVar253._8_4_ & auVar225._8_4_;
        auVar259._12_4_ = ~auVar253._12_4_ & auVar225._12_4_;
        auVar225 = auVar259 | auVar201;
        auVar289._4_4_ = -(uint)((fVar184 <= ABS(fVar274) || fVar227 <= 0.0) && bVar74);
        auVar289._0_4_ = -(uint)((fVar169 <= ABS(fVar260) || fVar204 <= 0.0) && bVar23);
        auVar289._8_4_ = -(uint)((fVar185 <= ABS(fVar282) || fVar229 <= 0.0) && bVar24);
        auVar289._12_4_ = -(uint)((fVar186 <= ABS(fVar292) || fVar233 <= 0.0) && bVar25);
      }
    }
    auVar290._0_4_ = (auVar289._0_4_ << 0x1f) >> 0x1f;
    auVar290._4_4_ = (auVar289._4_4_ << 0x1f) >> 0x1f;
    auVar290._8_4_ = (auVar289._8_4_ << 0x1f) >> 0x1f;
    auVar290._12_4_ = (auVar289._12_4_ << 0x1f) >> 0x1f;
    auVar290 = auVar290 & local_218;
    iVar61 = movmskps(iVar61,auVar290);
    uVar64 = uVar69;
    fStack_584 = local_548;
    fStack_580 = fStack_544;
    fStack_57c = fStack_540;
    fStack_4b4 = local_558;
    fStack_4b0 = fStack_554;
    fStack_4ac = fStack_550;
    if (iVar61 != 0) {
      local_438._4_4_ = fVar120;
      local_438._0_4_ = fVar80;
      fStack_430 = fVar122;
      fStack_42c = fVar125;
      local_238 = fVar152;
      fStack_234 = fVar153;
      fStack_230 = fVar154;
      fStack_22c = fVar167;
      local_358 = fVar260;
      fStack_354 = fVar274;
      fStack_350 = fVar282;
      fStack_34c = fVar292;
      _local_228 = auVar189;
      local_4c8._4_4_ = fVar247;
      local_4c8._0_4_ = fVar234;
      fStack_4c0 = fVar248;
      fStack_4bc = fVar262;
      auVar243._0_4_ = (ray->super_RayK<1>).org.field_0.m128[3] - (float)local_2e8._0_4_;
      auVar243._4_4_ = auVar243._0_4_;
      auVar243._8_4_ = auVar243._0_4_;
      auVar243._12_4_ = auVar243._0_4_;
      auVar267 = maxps(auVar243,auVar139);
      auVar190._0_4_ = (ray->super_RayK<1>).tfar - (float)local_2e8._0_4_;
      auVar190._4_4_ = auVar190._0_4_;
      auVar190._8_4_ = auVar190._0_4_;
      auVar190._12_4_ = auVar190._0_4_;
      auVar156 = minps(auVar190,auVar225);
      auVar104._0_4_ = local_378 * local_588 + local_388 * local_4b8;
      auVar104._4_4_ = fStack_374 * local_548 + fStack_384 * local_558;
      auVar104._8_4_ = fStack_370 * fStack_544 + fStack_380 * fStack_554;
      auVar104._12_4_ = fStack_36c * fStack_540 + fStack_37c * fStack_550;
      auVar140._0_4_ =
           (float)local_528._0_4_ * local_2f8 + local_588 * local_3f8 + local_4b8 * local_348;
      auVar140._4_4_ = local_538 * fStack_2f4 + local_548 * fStack_3f4 + local_558 * fStack_344;
      auVar140._8_4_ = fStack_534 * fStack_2f0 + fStack_544 * fStack_3f0 + fStack_554 * fStack_340;
      auVar140._12_4_ = fStack_530 * fStack_2ec + fStack_540 * fStack_3ec + fStack_550 * fStack_33c;
      auVar82 = rcpps(auVar104,auVar140);
      fVar169 = auVar82._0_4_;
      fVar184 = auVar82._4_4_;
      fVar185 = auVar82._8_4_;
      fVar186 = auVar82._12_4_;
      fVar169 = ((1.0 - auVar140._0_4_ * fVar169) * fVar169 + fVar169) *
                -(fVar203 * (float)local_528._0_4_ + auVar104._0_4_);
      fVar184 = ((1.0 - auVar140._4_4_ * fVar184) * fVar184 + fVar184) *
                -(fVar205 * local_538 + auVar104._4_4_);
      fVar185 = ((1.0 - auVar140._8_4_ * fVar185) * fVar185 + fVar185) *
                -(fVar228 * fStack_534 + auVar104._8_4_);
      fVar186 = ((1.0 - auVar140._12_4_ * fVar186) * fVar186 + fVar186) *
                -(fVar232 * fStack_530 + auVar104._12_4_);
      auVar231._0_12_ = ZEXT812(0);
      auVar231._12_4_ = 0.0;
      uVar75 = -(uint)(auVar140._0_4_ < 0.0 || ABS(auVar140._0_4_) < 1e-18);
      uVar76 = -(uint)(auVar140._4_4_ < 0.0 || ABS(auVar140._4_4_) < 1e-18);
      uVar77 = -(uint)(auVar140._8_4_ < 0.0 || ABS(auVar140._8_4_) < 1e-18);
      uVar78 = -(uint)(auVar140._12_4_ < 0.0 || ABS(auVar140._12_4_) < 1e-18);
      auVar226._0_8_ = CONCAT44(uVar76,uVar75) & 0xff800000ff800000;
      auVar226._8_4_ = uVar77 & 0xff800000;
      auVar226._12_4_ = uVar78 & 0xff800000;
      auVar105._0_4_ = ~uVar75 & (uint)fVar169;
      auVar105._4_4_ = ~uVar76 & (uint)fVar184;
      auVar105._8_4_ = ~uVar77 & (uint)fVar185;
      auVar105._12_4_ = ~uVar78 & (uint)fVar186;
      auVar267 = maxps(auVar267,auVar105 | auVar226);
      uVar75 = -(uint)(0.0 < auVar140._0_4_ || ABS(auVar140._0_4_) < 1e-18);
      uVar76 = -(uint)(0.0 < auVar140._4_4_ || ABS(auVar140._4_4_) < 1e-18);
      uVar77 = -(uint)(0.0 < auVar140._8_4_ || ABS(auVar140._8_4_) < 1e-18);
      uVar78 = -(uint)(0.0 < auVar140._12_4_ || ABS(auVar140._12_4_) < 1e-18);
      auVar106._0_8_ = CONCAT44(uVar76,uVar75) & 0x7f8000007f800000;
      auVar106._8_4_ = uVar77 & 0x7f800000;
      auVar106._12_4_ = uVar78 & 0x7f800000;
      auVar141._0_4_ = ~uVar75 & (uint)fVar169;
      auVar141._4_4_ = ~uVar76 & (uint)fVar184;
      auVar141._8_4_ = ~uVar77 & (uint)fVar185;
      auVar141._12_4_ = ~uVar78 & (uint)fVar186;
      auVar156 = minps(auVar156,auVar141 | auVar106);
      auVar142._0_4_ = (0.0 - fVar321) * -local_548 + (0.0 - fVar306) * -local_558;
      auVar142._4_4_ = (0.0 - fVar322) * -fStack_544 + (0.0 - fVar308) * -fStack_554;
      auVar142._8_4_ = (0.0 - fVar323) * -fStack_540 + (0.0 - fVar310) * -fStack_550;
      auVar142._12_4_ = 0x80000000;
      auVar319._0_4_ = -local_538 * local_2f8 + -local_548 * local_3f8 + -local_558 * local_348;
      auVar319._4_4_ =
           -fStack_534 * fStack_2f4 + -fStack_544 * fStack_3f4 + -fStack_554 * fStack_344;
      auVar319._8_4_ =
           -fStack_530 * fStack_2f0 + -fStack_540 * fStack_3f0 + -fStack_550 * fStack_340;
      auVar319._12_4_ = fStack_2ec * -0.0 + fStack_3ec * -0.0 + fStack_33c * -0.0;
      auVar82 = rcpps(auVar142,auVar319);
      fVar169 = auVar82._0_4_;
      fVar184 = auVar82._4_4_;
      fVar185 = auVar82._8_4_;
      fVar186 = auVar82._12_4_;
      fVar169 = ((fVar261 - auVar319._0_4_ * fVar169) * fVar169 + fVar169) *
                -((0.0 - (float)local_578._4_4_) * -local_538 + auVar142._0_4_);
      fVar184 = ((fVar281 - auVar319._4_4_ * fVar184) * fVar184 + fVar184) *
                -((0.0 - fStack_570) * -fStack_534 + auVar142._4_4_);
      fVar185 = ((fVar283 - auVar319._8_4_ * fVar185) * fVar185 + fVar185) *
                -((0.0 - fStack_56c) * -fStack_530 + auVar142._8_4_);
      fVar186 = ((fVar294 - auVar319._12_4_ * fVar186) * fVar186 + fVar186) * 0.0;
      uVar75 = -(uint)(auVar319._0_4_ < 0.0 || ABS(auVar319._0_4_) < 1e-18);
      uVar76 = -(uint)(auVar319._4_4_ < 0.0 || ABS(auVar319._4_4_) < 1e-18);
      uVar77 = -(uint)(auVar319._8_4_ < 0.0 || ABS(auVar319._8_4_) < 1e-18);
      uVar78 = -(uint)(auVar319._12_4_ < 0.0 || ABS(auVar319._12_4_) < 1e-18);
      auVar143._0_8_ = CONCAT44(uVar76,uVar75) & 0xff800000ff800000;
      auVar143._8_4_ = uVar77 & 0xff800000;
      auVar143._12_4_ = uVar78 & 0xff800000;
      auVar107._0_4_ = ~uVar75 & (uint)fVar169;
      auVar107._4_4_ = ~uVar76 & (uint)fVar184;
      auVar107._8_4_ = ~uVar77 & (uint)fVar185;
      auVar107._12_4_ = ~uVar78 & (uint)fVar186;
      local_3d8 = maxps(auVar267,auVar107 | auVar143);
      uVar75 = -(uint)(0.0 < auVar319._0_4_ || ABS(auVar319._0_4_) < 1e-18);
      uVar76 = -(uint)(0.0 < auVar319._4_4_ || ABS(auVar319._4_4_) < 1e-18);
      uVar77 = -(uint)(0.0 < auVar319._8_4_ || ABS(auVar319._8_4_) < 1e-18);
      uVar78 = -(uint)(0.0 < auVar319._12_4_ || ABS(auVar319._12_4_) < 1e-18);
      auVar108._0_8_ = CONCAT44(uVar76,uVar75) & 0x7f8000007f800000;
      auVar108._8_4_ = uVar77 & 0x7f800000;
      auVar108._12_4_ = uVar78 & 0x7f800000;
      auVar320._0_4_ = ~uVar75 & (uint)fVar169;
      auVar320._4_4_ = ~uVar76 & (uint)fVar184;
      auVar320._8_4_ = ~uVar77 & (uint)fVar185;
      auVar320._12_4_ = ~uVar78 & (uint)fVar186;
      _local_528 = minps(auVar156,auVar320 | auVar108);
      fVar169 = local_3d8._12_4_;
      fVar184 = local_3d8._0_4_;
      fVar185 = local_3d8._4_4_;
      fVar186 = local_3d8._8_4_;
      auVar302._0_4_ = -(uint)(fVar184 <= local_528._0_4_) & auVar290._0_4_;
      auVar302._4_4_ = -(uint)(fVar185 <= local_528._4_4_) & auVar290._4_4_;
      auVar302._8_4_ = -(uint)(fVar186 <= local_528._8_4_) & auVar290._8_4_;
      auVar302._12_4_ = -(uint)(fVar169 <= local_528._12_4_) & auVar290._12_4_;
      iVar61 = movmskps(iVar61,auVar302);
      if (iVar61 != 0) {
        auVar82 = maxps(ZEXT816(0),_local_5f8);
        auVar36._4_4_ = local_2c8[1];
        auVar36._0_4_ = local_2c8[0];
        auVar36._8_4_ = local_2c8[2];
        auVar36._12_4_ = local_2c8[3];
        auVar156 = minps(auVar36,_DAT_01feca10);
        auVar156 = maxps(auVar156,auVar231);
        auVar35._4_4_ = local_2d8[1];
        auVar35._0_4_ = local_2d8[0];
        auVar35._8_4_ = local_2d8[2];
        auVar35._12_4_ = local_2d8[3];
        auVar267 = minps(auVar35,_DAT_01feca10);
        auVar267 = maxps(auVar267,auVar231);
        local_2c8[0] = (auVar156._0_4_ + 0.0) * (float)DAT_01ff1da0 * local_398 + fVar168;
        local_2c8[1] = (auVar156._4_4_ + 1.0) * DAT_01ff1da0._4_4_ * local_398 + fVar168;
        local_2c8[2] = (auVar156._8_4_ + 2.0) * DAT_01ff1da0._8_4_ * local_398 + fVar168;
        local_2c8[3] = (auVar156._12_4_ + 3.0) * DAT_01ff1da0._12_4_ * local_398 + fVar168;
        local_2d8[0] = (auVar267._0_4_ + 0.0) * (float)DAT_01ff1da0 * local_398 + fVar168;
        local_2d8[1] = (auVar267._4_4_ + 1.0) * DAT_01ff1da0._4_4_ * local_398 + fVar168;
        local_2d8[2] = (auVar267._8_4_ + 2.0) * DAT_01ff1da0._8_4_ * local_398 + fVar168;
        local_2d8[3] = (auVar267._12_4_ + 3.0) * DAT_01ff1da0._12_4_ * local_398 + fVar168;
        auVar144._0_4_ = fVar234 - auVar82._0_4_ * auVar82._0_4_;
        auVar144._4_4_ = fVar247 - auVar82._4_4_ * auVar82._4_4_;
        auVar144._8_4_ = fVar248 - auVar82._8_4_ * auVar82._8_4_;
        auVar144._12_4_ = fVar262 - auVar82._12_4_ * auVar82._12_4_;
        auVar244._0_4_ = (float)local_3b8._0_4_ - fVar80 * auVar144._0_4_;
        auVar244._4_4_ = (float)local_3b8._4_4_ - fVar120 * auVar144._4_4_;
        auVar244._8_4_ = fStack_3b0 - fVar122 * auVar144._8_4_;
        auVar244._12_4_ = fStack_3ac - fVar125 * auVar144._12_4_;
        local_438._4_4_ = -(uint)(0.0 <= auVar244._4_4_);
        local_438._0_4_ = -(uint)(0.0 <= auVar244._0_4_);
        fStack_430 = (float)-(uint)(0.0 <= auVar244._8_4_);
        fStack_42c = (float)-(uint)(0.0 <= auVar244._12_4_);
        iVar61 = movmskps(iVar61,_local_438);
        if (iVar61 == 0) {
          fVar233 = 0.0;
          fVar234 = 0.0;
          fVar247 = 0.0;
          fVar248 = 0.0;
          fVar227 = 0.0;
          fVar228 = 0.0;
          fVar229 = 0.0;
          fVar232 = 0.0;
          fVar168 = 0.0;
          fVar80 = 0.0;
          fVar120 = 0.0;
          fVar122 = 0.0;
          fVar125 = 0.0;
          fVar203 = 0.0;
          fVar204 = 0.0;
          fVar205 = 0.0;
          _local_498 = ZEXT816(0);
          iVar61 = 0;
          auVar145 = _DAT_01feba00;
          auVar254 = _DAT_01feb9f0;
        }
        else {
          auVar156 = sqrtps(_DAT_01ff1da0,auVar244);
          auVar109._0_4_ = fVar260 + fVar260;
          auVar109._4_4_ = fVar274 + fVar274;
          auVar109._8_4_ = fVar282 + fVar282;
          auVar109._12_4_ = fVar292 + fVar292;
          auVar82 = rcpps(auVar144,auVar109);
          fVar262 = auVar82._0_4_;
          fVar272 = auVar82._4_4_;
          fVar273 = auVar82._8_4_;
          fVar311 = auVar82._12_4_;
          fVar262 = (fVar261 - auVar109._0_4_ * fVar262) * fVar262 + fVar262;
          fVar272 = (fVar281 - auVar109._4_4_ * fVar272) * fVar272 + fVar272;
          fVar273 = (fVar283 - auVar109._8_4_ * fVar273) * fVar273 + fVar273;
          fVar311 = (fVar294 - auVar109._12_4_ * fVar311) * fVar311 + fVar311;
          fVar293 = (-(float)local_498._0_4_ - auVar156._0_4_) * fVar262;
          fVar294 = (-(float)local_498._4_4_ - auVar156._4_4_) * fVar272;
          fVar295 = (-fStack_490 - auVar156._8_4_) * fVar273;
          fVar305 = (-fStack_48c - auVar156._12_4_) * fVar311;
          fVar262 = (auVar156._0_4_ - (float)local_498._0_4_) * fVar262;
          fVar272 = (auVar156._4_4_ - (float)local_498._4_4_) * fVar272;
          fVar273 = (auVar156._8_4_ - fStack_490) * fVar273;
          fVar311 = (auVar156._12_4_ - fStack_48c) * fVar311;
          local_228._0_4_ = auVar189._0_4_;
          local_228._4_4_ = auVar189._4_4_;
          fStack_220 = auVar189._8_4_;
          fStack_21c = auVar189._12_4_;
          fVar227 = ((float)local_308._0_4_ * fVar293 + (float)local_318._0_4_) *
                    (float)local_228._0_4_;
          fVar228 = ((float)local_308._4_4_ * fVar294 + (float)local_318._4_4_) *
                    (float)local_228._4_4_;
          fVar229 = (fStack_300 * fVar295 + fStack_310) * fStack_220;
          fVar232 = (fStack_2fc * fVar305 + fStack_30c) * fStack_21c;
          fVar168 = local_2f8 * fVar293 -
                    ((float)local_428._0_4_ * fVar227 + (float)local_578._0_4_);
          fVar80 = fStack_2f4 * fVar294 -
                   ((float)local_428._4_4_ * fVar228 + (float)local_578._4_4_);
          fVar120 = fStack_2f0 * fVar295 - (fStack_420 * fVar229 + fStack_570);
          fVar122 = fStack_2ec * fVar305 - (fStack_41c * fVar232 + fStack_56c);
          fVar125 = local_3f8 * fVar293 - (local_3e8 * fVar227 + fVar318);
          fVar203 = fStack_3f4 * fVar294 - (fStack_3e4 * fVar228 + fVar321);
          fVar204 = fStack_3f0 * fVar295 - (fStack_3e0 * fVar229 + fVar322);
          fVar205 = fStack_3ec * fVar305 - (fStack_3dc * fVar232 + fVar323);
          local_498._4_4_ = fStack_344 * fVar294 - (fVar228 * (float)local_418._4_4_ + fVar306);
          local_498._0_4_ = local_348 * fVar293 - (fVar227 * (float)local_418._0_4_ + fVar296);
          fStack_490 = fStack_340 * fVar295 - (fVar229 * fStack_410 + fVar308);
          fStack_48c = fStack_33c * fVar305 - (fVar232 * fStack_40c + fVar310);
          fVar249 = ((float)local_308._0_4_ * fVar262 + (float)local_318._0_4_) *
                    (float)local_228._0_4_;
          fVar261 = ((float)local_308._4_4_ * fVar272 + (float)local_318._4_4_) *
                    (float)local_228._4_4_;
          fVar281 = (fStack_300 * fVar273 + fStack_310) * fStack_220;
          fVar283 = (fStack_2fc * fVar311 + fStack_30c) * fStack_21c;
          fVar233 = local_2f8 * fVar262 -
                    ((float)local_428._0_4_ * fVar249 + (float)local_578._0_4_);
          fVar234 = fStack_2f4 * fVar272 -
                    ((float)local_428._4_4_ * fVar261 + (float)local_578._4_4_);
          fVar247 = fStack_2f0 * fVar273 - (fStack_420 * fVar281 + fStack_570);
          fVar248 = fStack_2ec * fVar311 - (fStack_41c * fVar283 + fStack_56c);
          fVar227 = local_3f8 * fVar262 - (local_3e8 * fVar249 + fVar318);
          fVar228 = fStack_3f4 * fVar272 - (fStack_3e4 * fVar261 + fVar321);
          fVar229 = fStack_3f0 * fVar273 - (fStack_3e0 * fVar281 + fVar322);
          fVar232 = fStack_3ec * fVar311 - (fStack_3dc * fVar283 + fVar323);
          bVar23 = 0.0 <= auVar244._0_4_;
          uVar75 = -(uint)bVar23;
          bVar74 = 0.0 <= auVar244._4_4_;
          uVar76 = -(uint)bVar74;
          bVar24 = 0.0 <= auVar244._8_4_;
          uVar77 = -(uint)bVar24;
          bVar25 = 0.0 <= auVar244._12_4_;
          uVar78 = -(uint)bVar25;
          auVar231._0_4_ = local_348 * fVar262 - (fVar249 * (float)local_418._0_4_ + fVar296);
          auVar231._4_4_ = fStack_344 * fVar272 - (fVar261 * (float)local_418._4_4_ + fVar306);
          auVar231._8_4_ = fStack_340 * fVar273 - (fVar281 * fStack_410 + fVar308);
          auVar231._12_4_ = fStack_33c * fVar311 - (fVar283 * fStack_40c + fVar310);
          auVar270._0_4_ = (uint)fVar293 & uVar75;
          auVar270._4_4_ = (uint)fVar294 & uVar76;
          auVar270._8_4_ = (uint)fVar295 & uVar77;
          auVar270._12_4_ = (uint)fVar305 & uVar78;
          auVar254._0_8_ = CONCAT44(~uVar76,~uVar75) & 0x7f8000007f800000;
          auVar254._8_4_ = ~uVar77 & 0x7f800000;
          auVar254._12_4_ = ~uVar78 & 0x7f800000;
          auVar254 = auVar254 | auVar270;
          auVar191._0_4_ = (uint)fVar262 & uVar75;
          auVar191._4_4_ = (uint)fVar272 & uVar76;
          auVar191._8_4_ = (uint)fVar273 & uVar77;
          auVar191._12_4_ = (uint)fVar311 & uVar78;
          auVar145._0_8_ = CONCAT44(~uVar76,~uVar75) & 0xff800000ff800000;
          auVar145._8_4_ = ~uVar77 & 0xff800000;
          auVar145._12_4_ = ~uVar78 & 0xff800000;
          auVar145 = auVar145 | auVar191;
          auVar110._0_8_ = CONCAT44(fVar153,fVar152) & 0x7fffffff7fffffff;
          auVar110._8_4_ = ABS(fVar154);
          auVar110._12_4_ = ABS(fVar167);
          auVar38._4_4_ = fStack_294;
          auVar38._0_4_ = local_298;
          auVar38._8_4_ = fStack_290;
          auVar38._12_4_ = fStack_28c;
          auVar82 = maxps(auVar38,auVar110);
          fVar152 = auVar82._0_4_ * 1.9073486e-06;
          fVar153 = auVar82._4_4_ * 1.9073486e-06;
          fVar154 = auVar82._8_4_ * 1.9073486e-06;
          fVar167 = auVar82._12_4_ * 1.9073486e-06;
          auVar192._0_4_ = -(uint)(ABS(fVar260) < fVar152 && bVar23);
          auVar192._4_4_ = -(uint)(ABS(fVar274) < fVar153 && bVar74);
          auVar192._8_4_ = -(uint)(ABS(fVar282) < fVar154 && bVar24);
          auVar192._12_4_ = -(uint)(ABS(fVar292) < fVar167 && bVar25);
          iVar61 = movmskps(iVar61,auVar192);
          _local_598 = auVar302;
          local_588 = fVar125;
          fStack_584 = fVar203;
          fStack_580 = fVar204;
          fStack_57c = fVar205;
          _local_4c8 = auVar144;
          if (iVar61 != 0) {
            uVar75 = -(uint)(auVar144._0_4_ <= 0.0);
            uVar76 = -(uint)(auVar144._4_4_ <= 0.0);
            uVar77 = -(uint)(auVar144._8_4_ <= 0.0);
            uVar78 = -(uint)(auVar144._12_4_ <= 0.0);
            auVar279._0_4_ = (uVar75 & 0xff800000 | ~uVar75 & 0x7f800000) & auVar192._0_4_;
            auVar279._4_4_ = (uVar76 & 0xff800000 | ~uVar76 & 0x7f800000) & auVar192._4_4_;
            auVar279._8_4_ = (uVar77 & 0xff800000 | ~uVar77 & 0x7f800000) & auVar192._8_4_;
            auVar279._12_4_ = (uVar78 & 0xff800000 | ~uVar78 & 0x7f800000) & auVar192._12_4_;
            auVar271._0_4_ = ~auVar192._0_4_ & auVar254._0_4_;
            auVar271._4_4_ = ~auVar192._4_4_ & auVar254._4_4_;
            auVar271._8_4_ = ~auVar192._8_4_ & auVar254._8_4_;
            auVar271._12_4_ = ~auVar192._12_4_ & auVar254._12_4_;
            auVar254 = auVar271 | auVar279;
            auVar280._0_4_ = (uVar75 & 0x7f800000 | ~uVar75 & 0xff800000) & auVar192._0_4_;
            auVar280._4_4_ = (uVar76 & 0x7f800000 | ~uVar76 & 0xff800000) & auVar192._4_4_;
            auVar280._8_4_ = (uVar77 & 0x7f800000 | ~uVar77 & 0xff800000) & auVar192._8_4_;
            auVar280._12_4_ = (uVar78 & 0x7f800000 | ~uVar78 & 0xff800000) & auVar192._12_4_;
            auVar202._0_4_ = ~auVar192._0_4_ & auVar145._0_4_;
            auVar202._4_4_ = ~auVar192._4_4_ & auVar145._4_4_;
            auVar202._8_4_ = ~auVar192._8_4_ & auVar145._8_4_;
            auVar202._12_4_ = ~auVar192._12_4_ & auVar145._12_4_;
            auVar145 = auVar202 | auVar280;
            local_438._4_4_ = -(uint)((fVar153 <= ABS(fVar274) || auVar144._4_4_ <= 0.0) && bVar74);
            local_438._0_4_ = -(uint)((fVar152 <= ABS(fVar260) || auVar144._0_4_ <= 0.0) && bVar23);
            fStack_430 = (float)-(uint)((fVar154 <= ABS(fVar282) || auVar144._8_4_ <= 0.0) && bVar24
                                       );
            fStack_42c = (float)-(uint)((fVar167 <= ABS(fVar292) || auVar144._12_4_ <= 0.0) &&
                                       bVar25);
          }
        }
        fVar152 = (ray->super_RayK<1>).dir.field_0.m128[0];
        fVar153 = (ray->super_RayK<1>).dir.field_0.m128[1];
        fVar154 = (ray->super_RayK<1>).dir.field_0.m128[2];
        local_418._4_4_ =
             -(uint)(0.3 <= ABS(fVar234 * fVar152 + fVar228 * fVar153 + auVar231._4_4_ * fVar154));
        local_418._0_4_ =
             -(uint)(0.3 <= ABS(fVar233 * fVar152 + fVar227 * fVar153 + auVar231._0_4_ * fVar154));
        fStack_410 = (float)-(uint)(0.3 <= ABS(fVar247 * fVar152 +
                                               fVar229 * fVar153 + auVar231._8_4_ * fVar154));
        fStack_40c = (float)-(uint)(0.3 <= ABS(fVar248 * fVar152 +
                                               fVar232 * fVar153 + auVar231._12_4_ * fVar154));
        _local_118 = local_3d8;
        local_108 = minps(_local_528,auVar254);
        _local_268 = maxps(local_3d8,auVar145);
        local_258 = _local_528;
        auVar291._0_4_ = -(uint)(fVar184 <= local_108._0_4_) & auVar302._0_4_;
        auVar291._4_4_ = -(uint)(fVar185 <= local_108._4_4_) & auVar302._4_4_;
        auVar291._8_4_ = -(uint)(fVar186 <= local_108._8_4_) & auVar302._8_4_;
        auVar291._12_4_ = -(uint)(fVar169 <= local_108._12_4_) & auVar302._12_4_;
        local_328 = auVar291;
        _local_428 = _local_268;
        local_338._0_4_ = -(uint)(local_268._0_4_ <= local_528._0_4_) & auVar302._0_4_;
        local_338._4_4_ = -(uint)(local_268._4_4_ <= local_528._4_4_) & auVar302._4_4_;
        local_338._8_4_ = -(uint)(local_268._8_4_ <= local_528._8_4_) & auVar302._8_4_;
        local_338._12_4_ = -(uint)(local_268._12_4_ <= local_528._12_4_) & auVar302._12_4_;
        _local_308 = local_338;
        iVar61 = movmskps(iVar61,local_338 | auVar291);
        if (iVar61 != 0) {
          local_358 = (float)local_4a0;
          fStack_354 = (float)local_4a0;
          fStack_350 = (float)local_4a0;
          fStack_34c = (float)local_4a0;
          local_498._0_4_ =
               -(uint)((int)(float)local_4a0 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_498._0_4_ * fVar154 +
                                                 fVar125 * fVar153 + fVar168 * fVar152)) &
                             local_438._0_4_) << 0x1f) >> 0x1f) + 4);
          local_498._4_4_ =
               -(uint)((int)(float)local_4a0 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_498._4_4_ * fVar154 +
                                                 fVar203 * fVar153 + fVar80 * fVar152)) &
                             local_438._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_490 = (float)-(uint)((int)(float)local_4a0 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_490 * fVar154 +
                                                                fVar204 * fVar153 +
                                                                fVar120 * fVar152)) &
                                            (uint)fStack_430) << 0x1f) >> 0x1f) + 4);
          fStack_48c = (float)-(uint)((int)(float)local_4a0 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_48c * fVar154 +
                                                                fVar205 * fVar153 +
                                                                fVar122 * fVar152)) &
                                            (uint)fStack_42c) << 0x1f) >> 0x1f) + 4);
          local_328 = ~_local_498 & auVar291;
          iVar61 = movmskps(iVar61,local_328);
          _local_318 = auVar291;
          if (iVar61 != 0) {
            local_3e8 = local_3c8 + fVar184;
            fStack_3e4 = fStack_3c4 + fVar185;
            fStack_3e0 = fStack_3c0 + fVar186;
            fStack_3dc = fStack_3bc + fVar169;
            do {
              auVar156 = ~local_328 & _DAT_01feb9f0 | local_328 & local_3d8;
              auVar177._4_4_ = auVar156._0_4_;
              auVar177._0_4_ = auVar156._4_4_;
              auVar177._8_4_ = auVar156._12_4_;
              auVar177._12_4_ = auVar156._8_4_;
              auVar82 = minps(auVar177,auVar156);
              auVar146._0_8_ = auVar82._8_8_;
              auVar146._8_4_ = auVar82._0_4_;
              auVar146._12_4_ = auVar82._4_4_;
              auVar82 = minps(auVar146,auVar82);
              auVar147._0_8_ =
                   CONCAT44(-(uint)(auVar82._4_4_ == auVar156._4_4_) & local_328._4_4_,
                            -(uint)(auVar82._0_4_ == auVar156._0_4_) & local_328._0_4_);
              auVar147._8_4_ = -(uint)(auVar82._8_4_ == auVar156._8_4_) & local_328._8_4_;
              auVar147._12_4_ = -(uint)(auVar82._12_4_ == auVar156._12_4_) & local_328._12_4_;
              iVar61 = movmskps(iVar61,auVar147);
              auVar111 = local_328;
              if (iVar61 != 0) {
                auVar111._8_4_ = auVar147._8_4_;
                auVar111._0_8_ = auVar147._0_8_;
                auVar111._12_4_ = auVar147._12_4_;
              }
              uVar62 = movmskps(iVar61,auVar111);
              pRVar65 = (RayHit *)0x0;
              if (CONCAT44(uVar67,uVar62) != 0) {
                for (; (CONCAT44(uVar67,uVar62) >> (long)pRVar65 & 1) == 0;
                    pRVar65 = (RayHit *)((long)(pRVar65->super_RayK<1>).org.field_0.m128 + 1)) {
                }
              }
              *(undefined4 *)(local_328 + (long)pRVar65 * 4) = 0;
              fVar168 = local_2c8[(long)pRVar65];
              auVar245 = ZEXT416(*(uint *)(local_118 + (long)pRVar65 * 4));
              local_588 = (ray->super_RayK<1>).dir.field_0.m128[0];
              fStack_584 = (ray->super_RayK<1>).dir.field_0.m128[1];
              fStack_580 = (ray->super_RayK<1>).dir.field_0.m128[2];
              fStack_57c = (ray->super_RayK<1>).dir.field_0.m128[3];
              fVar80 = fStack_580 * fStack_580 + fStack_584 * fStack_584 + local_588 * local_588;
              if (fVar80 < 0.0) {
                fVar80 = sqrtf(fVar80);
                pRVar65 = extraout_RAX;
              }
              else {
                fVar80 = SQRT(fVar80);
              }
              auVar29._4_4_ = fStack_504;
              auVar29._0_4_ = local_508;
              auVar29._8_4_ = fStack_500;
              auVar29._12_4_ = fStack_4fc;
              auVar156 = minps(_local_568,auVar29);
              auVar267 = maxps(_local_568,auVar29);
              auVar31._4_4_ = fStack_484;
              auVar31._0_4_ = local_488;
              auVar31._8_4_ = fStack_480;
              auVar31._12_4_ = fStack_47c;
              auVar33._4_4_ = fStack_474;
              auVar33._0_4_ = local_478;
              auVar33._8_4_ = fStack_470;
              auVar33._12_4_ = fStack_46c;
              auVar82 = minps(auVar31,auVar33);
              auVar156 = minps(auVar156,auVar82);
              auVar82 = maxps(auVar31,auVar33);
              auVar82 = maxps(auVar267,auVar82);
              auVar193._0_8_ = auVar156._0_8_ & 0x7fffffff7fffffff;
              auVar193._8_4_ = auVar156._8_4_ & 0x7fffffff;
              auVar193._12_4_ = auVar156._12_4_ & 0x7fffffff;
              local_4c8._4_4_ = auVar82._12_4_;
              auVar112._0_8_ = auVar82._0_8_ & 0x7fffffff7fffffff;
              auVar112._8_4_ = auVar82._8_4_ & 0x7fffffff;
              auVar112._12_4_ = local_4c8._4_4_ & 0x7fffffff;
              auVar82 = maxps(auVar193,auVar112);
              fVar120 = auVar82._4_4_;
              if (auVar82._4_4_ <= auVar82._0_4_) {
                fVar120 = auVar82._0_4_;
              }
              auVar194._8_8_ = auVar82._8_8_;
              auVar194._0_8_ = auVar82._8_8_;
              if (auVar82._8_4_ <= fVar120) {
                auVar194._0_4_ = fVar120;
              }
              register0x00001304 = auVar194._4_12_;
              local_598._0_4_ = auVar194._0_4_ * 1.9073486e-06;
              local_388 = fVar80 * 1.9073486e-06;
              local_4c8._0_4_ = local_4c8._4_4_;
              fStack_4c0 = (float)local_4c8._4_4_;
              fStack_4bc = (float)local_4c8._4_4_;
              lVar73 = 4;
              do {
                fVar80 = 1.0 - fVar168;
                fVar153 = local_508 * fVar80 + local_488 * fVar168;
                fVar167 = fStack_504 * fVar80 + fStack_484 * fVar168;
                fVar169 = fStack_500 * fVar80 + fStack_480 * fVar168;
                fVar184 = fStack_4fc * fVar80 + fStack_47c * fVar168;
                fVar120 = ((float)local_568._0_4_ * fVar80 + local_508 * fVar168) * fVar80 +
                          fVar168 * fVar153;
                fVar122 = ((float)local_568._4_4_ * fVar80 + fStack_504 * fVar168) * fVar80 +
                          fVar168 * fVar167;
                fVar125 = (fStack_560 * fVar80 + fStack_500 * fVar168) * fVar80 + fVar168 * fVar169;
                fVar152 = (fStack_55c * fVar80 + fStack_4fc * fVar168) * fVar80 + fVar168 * fVar184;
                fVar154 = fVar153 * fVar80 + (local_488 * fVar80 + local_478 * fVar168) * fVar168;
                fVar167 = fVar167 * fVar80 + (fStack_484 * fVar80 + fStack_474 * fVar168) * fVar168;
                fVar169 = fVar169 * fVar80 + (fStack_480 * fVar80 + fStack_470 * fVar168) * fVar168;
                fVar184 = fVar184 * fVar80 + (fStack_47c * fVar80 + fStack_46c * fVar168) * fVar168;
                fVar153 = auVar245._0_4_;
                local_368._0_4_ = fVar80 * fVar120 + fVar168 * fVar154;
                local_368._4_4_ = fVar80 * fVar122 + fVar168 * fVar167;
                fStack_360 = fVar80 * fVar125 + fVar168 * fVar169;
                fStack_35c = fVar80 * fVar152 + fVar168 * fVar184;
                fVar154 = (fVar154 - fVar120) * 3.0;
                fVar167 = (fVar167 - fVar122) * 3.0;
                fVar169 = (fVar169 - fVar125) * 3.0;
                fVar152 = (fVar184 - fVar152) * 3.0;
                local_528._0_4_ = (fVar153 * local_588 + 0.0) - (float)local_368._0_4_;
                local_528._4_4_ = (fVar153 * fStack_584 + 0.0) - (float)local_368._4_4_;
                fStack_520 = (fVar153 * fStack_580 + 0.0) - fStack_360;
                fStack_51c = (fVar153 * fStack_57c + 0.0) - fStack_35c;
                fVar120 = (float)local_528._4_4_ * (float)local_528._4_4_;
                fVar122 = fStack_520 * fStack_520;
                fVar125 = fStack_51c * fStack_51c;
                local_578._0_4_ =
                     fVar120 + (float)local_528._0_4_ * (float)local_528._0_4_ + fVar122;
                local_578._4_4_ = fVar120 + fVar120 + fVar125;
                fStack_570 = fVar120 + fVar122 + fVar122;
                fStack_56c = fVar120 + fVar125 + fVar125;
                local_378 = (float)local_578._0_4_;
                if ((float)local_578._0_4_ < 0.0) {
                  local_5b8 = ZEXT416((uint)fVar80);
                  fVar120 = sqrtf((float)local_578._0_4_);
                  pRVar66 = extraout_RAX_00;
                  fVar80 = (float)local_5b8._0_4_;
                }
                else {
                  fVar120 = SQRT((float)local_578._0_4_);
                  pRVar66 = pRVar65;
                }
                fVar184 = fVar80 * 6.0;
                fVar122 = (fVar168 - (fVar80 + fVar80)) * 6.0;
                fVar125 = (fVar80 - (fVar168 + fVar168)) * 6.0;
                fVar80 = fVar168 * 6.0;
                fVar185 = fVar184 * (float)local_568._0_4_ +
                          fVar122 * local_508 + fVar125 * local_488 + fVar80 * local_478;
                fVar186 = fVar184 * (float)local_568._4_4_ +
                          fVar122 * fStack_504 + fVar125 * fStack_484 + fVar80 * fStack_474;
                fVar203 = fVar184 * fStack_560 +
                          fVar122 * fStack_500 + fVar125 * fStack_480 + fVar80 * fStack_470;
                local_4b8 = (float)local_598._0_4_;
                if ((float)local_598._0_4_ <= local_388 * fVar153) {
                  local_4b8 = local_388 * fVar153;
                }
                fVar204 = fVar167 * fVar167 + fVar154 * fVar154 + fVar169 * fVar169;
                auVar156 = ZEXT416((uint)fVar204);
                auVar82 = rsqrtss(ZEXT416((uint)fVar204),auVar156);
                fVar205 = auVar82._0_4_;
                fVar205 = fVar205 * fVar205 * fVar204 * -0.5 * fVar205 + fVar205 * 1.5;
                fVar227 = fVar169 * fVar203 + fVar167 * fVar186 + fVar154 * fVar185;
                auVar82 = rcpss(auVar156,auVar156);
                fVar228 = (2.0 - fVar204 * auVar82._0_4_) * auVar82._0_4_;
                local_558 = fVar228 * (fVar204 * fVar185 - fVar227 * fVar154) * fVar205;
                fStack_554 = fVar228 * (fVar204 * fVar186 - fVar227 * fVar167) * fVar205;
                fStack_550 = fVar228 * (fVar204 * fVar203 - fVar227 * fVar169) * fVar205;
                fStack_54c = fVar228 * (fVar204 * (fVar184 * fStack_55c +
                                                  fVar122 * fStack_4fc +
                                                  fVar125 * fStack_47c + fVar80 * fStack_46c) -
                                       fVar227 * fVar152) * fVar205;
                fStack_4b4 = (float)local_598._4_4_;
                fStack_4b0 = fStack_590;
                fStack_4ac = fStack_58c;
                if (fVar204 < 0.0) {
                  local_5b8._0_4_ = fVar120;
                  local_548 = fVar154 * fVar205;
                  fStack_544 = fVar167 * fVar205;
                  fStack_540 = fVar169 * fVar205;
                  fStack_53c = fVar152 * fVar205;
                  local_538 = -fVar154;
                  fStack_534 = -fVar167;
                  fStack_530 = -fVar169;
                  fStack_52c = -fVar152;
                  fVar204 = sqrtf(fVar204);
                  pRVar66 = extraout_RAX_01;
                  fVar80 = local_538;
                  fVar122 = fStack_534;
                  fVar125 = fStack_530;
                  fVar184 = fStack_52c;
                  fVar120 = (float)local_5b8._0_4_;
                  fVar185 = local_548;
                  fVar186 = fStack_544;
                  fVar203 = fStack_540;
                  fVar205 = fStack_53c;
                }
                else {
                  fVar204 = SQRT(fVar204);
                  fVar80 = -fVar154;
                  fVar122 = -fVar167;
                  fVar125 = -fVar169;
                  fVar184 = -fVar152;
                  fVar185 = fVar154 * fVar205;
                  fVar186 = fVar167 * fVar205;
                  fVar203 = fVar169 * fVar205;
                  fVar205 = fVar152 * fVar205;
                }
                fVar227 = (float)local_528._4_4_ * fVar186;
                fVar232 = fStack_520 * fVar203;
                fVar233 = fStack_51c * fVar205;
                fVar229 = fVar227 + (float)local_528._0_4_ * fVar185 + fVar232;
                fVar234 = fVar227 + fVar227 + fVar233;
                fVar232 = fVar227 + fVar232 + fVar232;
                fVar233 = fVar227 + fVar233 + fVar233;
                fVar227 = (fVar120 + 1.0) * ((float)local_598._0_4_ / fVar204) +
                          fVar120 * (float)local_598._0_4_ + local_4b8;
                fVar204 = fStack_57c * fVar205;
                fVar205 = fVar205 * fVar184;
                fVar228 = fVar203 * fVar125 + fVar186 * fVar122 + fVar185 * fVar80 +
                          fStack_550 * fStack_520 +
                          fStack_554 * (float)local_528._4_4_ + local_558 * (float)local_528._0_4_;
                fVar120 = fStack_580 * fVar203 + fStack_584 * fVar186 + local_588 * fVar185;
                fVar185 = local_578._0_4_ - fVar229 * fVar229;
                auVar113._0_8_ = CONCAT44(local_578._4_4_ - fVar234 * fVar234,fVar185);
                auVar113._8_4_ = local_578._8_4_ - fVar232 * fVar232;
                auVar113._12_4_ = local_578._12_4_ - fVar233 * fVar233;
                fVar184 = fVar184 * fStack_51c;
                fVar80 = (fVar125 * fStack_520 +
                         fVar122 * (float)local_528._4_4_ + fVar80 * (float)local_528._0_4_) -
                         fVar229 * fVar228;
                fStack_550 = fStack_580 * fStack_520;
                fStack_554 = fStack_57c * fStack_51c;
                local_558 = (fStack_550 +
                            fStack_584 * (float)local_528._4_4_ + local_588 * (float)local_528._0_4_
                            ) - fVar229 * fVar120;
                auVar178._8_4_ = auVar113._8_4_;
                auVar178._0_8_ = auVar113._0_8_;
                auVar178._12_4_ = auVar113._12_4_;
                auVar82 = rsqrtss(auVar178,auVar113);
                fVar122 = auVar82._0_4_;
                auVar179._4_12_ = auVar82._4_12_;
                auVar179._0_4_ = fVar122 * fVar122 * fVar185 * -0.5 * fVar122 + fVar122 * 1.5;
                fStack_54c = fStack_554;
                if (fVar185 < 0.0) {
                  local_5b8._0_4_ = fVar227;
                  local_548 = fVar228;
                  fStack_544 = fVar205;
                  fStack_540 = fVar203 * fVar125;
                  fStack_53c = fVar205;
                  local_538 = fVar80;
                  fStack_534 = fVar184;
                  fStack_530 = fVar125 * fStack_520;
                  fStack_52c = fVar184;
                  _local_3b8 = auVar179;
                  local_3a8 = fVar120;
                  fStack_3a4 = fVar204;
                  fStack_3a0 = fStack_580 * fVar203;
                  fStack_39c = fVar204;
                  local_398 = fVar229;
                  fStack_394 = fVar234;
                  fStack_390 = fVar232;
                  fStack_38c = fVar233;
                  fVar185 = sqrtf(fVar185);
                  pRVar66 = extraout_RAX_02;
                  auVar179 = _local_3b8;
                  fVar120 = local_3a8;
                  fVar204 = fStack_3a4;
                  fVar80 = local_538;
                  fVar184 = fStack_534;
                  fVar227 = (float)local_5b8._0_4_;
                  fVar228 = local_548;
                  fVar205 = fStack_544;
                  fVar229 = local_398;
                }
                else {
                  fVar185 = SQRT(fVar185);
                }
                fVar185 = fVar185 - fStack_35c;
                fVar80 = fVar80 * auVar179._0_4_ - fVar152;
                auVar27._4_4_ = fStack_554;
                auVar27._0_4_ = local_558;
                auVar27._8_4_ = fStack_550;
                auVar27._12_4_ = fStack_54c;
                auVar157._4_12_ = auVar27._4_12_;
                auVar157._0_4_ = local_558 * auVar179._0_4_;
                auVar256._0_8_ = CONCAT44(fVar184,fVar80) ^ 0x8000000080000000;
                auVar256._8_4_ = -fVar184;
                auVar256._12_4_ = fVar205;
                auVar255._8_8_ = auVar256._8_8_;
                auVar255._0_8_ = CONCAT44(fVar228,fVar80) ^ 0x80000000;
                auVar303._0_4_ = fVar228 * auVar157._0_4_ - fVar120 * fVar80;
                auVar159._0_8_ = auVar157._0_8_;
                auVar159._8_4_ = fStack_554;
                auVar159._12_4_ = -fVar204;
                auVar158._8_8_ = auVar159._8_8_;
                auVar158._0_8_ = CONCAT44(fVar120,auVar157._0_4_) ^ 0x8000000000000000;
                auVar303._4_4_ = auVar303._0_4_;
                auVar303._8_4_ = auVar303._0_4_;
                auVar303._12_4_ = auVar303._0_4_;
                auVar82 = divps(auVar158,auVar303);
                auVar156 = divps(auVar255,auVar303);
                fVar168 = fVar168 - (auVar82._4_4_ * fVar185 + auVar82._0_4_ * fVar229);
                auVar245._0_4_ = fVar153 - (auVar156._4_4_ * fVar185 + auVar156._0_4_ * fVar229);
                if ((fVar227 <= ABS(fVar229)) ||
                   ((float)local_4c8._0_4_ * 1.9073486e-06 + local_4b8 + fVar227 <= ABS(fVar185))) {
                  bVar23 = false;
                }
                else {
                  auVar245._0_4_ = auVar245._0_4_ + (float)local_2e8._0_4_;
                  bVar23 = true;
                  if (((((ray->super_RayK<1>).org.field_0.m128[3] <= auVar245._0_4_) &&
                       (fVar80 = (ray->super_RayK<1>).tfar, auVar245._0_4_ <= fVar80)) &&
                      (0.0 <= fVar168)) && (fVar168 <= 1.0)) {
                    auVar82 = rsqrtss(_local_578,_local_578);
                    fVar120 = auVar82._0_4_;
                    pGVar17 = (context->scene->geometries).items[(long)local_5a0].ptr;
                    uVar75 = (ray->super_RayK<1>).mask;
                    pRVar66 = (RayHit *)(ulong)uVar75;
                    pRVar68 = local_5a0;
                    if ((pGVar17->mask & uVar75) != 0) {
                      fVar120 = fVar120 * 1.5 + fVar120 * fVar120 * local_378 * -0.5 * fVar120;
                      fVar153 = (float)local_528._0_4_ * fVar120;
                      fVar185 = (float)local_528._4_4_ * fVar120;
                      fVar120 = fStack_520 * fVar120;
                      fVar125 = fVar152 * fVar153 + fVar154;
                      fVar122 = fVar152 * fVar185 + fVar167;
                      fVar152 = fVar152 * fVar120 + fVar169;
                      fVar184 = fVar185 * fVar154 - fVar167 * fVar153;
                      fVar167 = fVar120 * fVar167 - fVar169 * fVar185;
                      fVar153 = fVar153 * fVar169 - fVar154 * fVar120;
                      fVar120 = fVar122 * fVar167 - fVar153 * fVar125;
                      fVar122 = fVar152 * fVar153 - fVar184 * fVar122;
                      fVar125 = fVar125 * fVar184 - fVar167 * fVar152;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar17->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = auVar245._0_4_;
                        *(ulong *)&(ray->Ng).field_0 = CONCAT44(fVar125,fVar122);
                        (ray->Ng).field_0.field_0.z = fVar120;
                        ray->u = fVar168;
                        ray->v = 0.0;
                        ray->primID = (uint)local_510;
                        ray->geomID = (uint)local_5a0;
                        ray->instID[0] = context->user->instID[0];
                        uVar75 = context->user->instPrimID[0];
                        ray->instPrimID[0] = uVar75;
                        pRVar66 = (RayHit *)(ulong)uVar75;
                      }
                      else {
                        local_468 = CONCAT44(fVar125,fVar122);
                        fStack_460 = fVar120;
                        fStack_45c = fVar168;
                        local_458 = 0;
                        local_454 = (uint)local_510;
                        local_450 = (uint)local_5a0;
                        local_44c = context->user->instID[0];
                        pRVar68 = (RTCIntersectArguments *)(ulong)local_44c;
                        local_448 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = auVar245._0_4_;
                        local_5bc = 0xffffffff;
                        local_4f8.geometryUserPtr = pGVar17->userPtr;
                        local_4f8.valid = &local_5bc;
                        local_4f8.context = context->user;
                        local_4f8.hit = (RTCHitN *)&local_468;
                        local_4f8.N = 1;
                        local_4f8.ray = (RTCRayN *)ray;
                        if (pGVar17->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00bfb813:
                          pRVar68 = context->args;
                          if (pRVar68->filter != (RTCFilterFunctionN)0x0) {
                            if (((pRVar68->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar17->field_8).field_0x2 & 0x40) != 0)) {
                              (*pRVar68->filter)(&local_4f8);
                            }
                            if ((((RayK<1> *)local_4f8.valid)->org).field_0.m128[0] == 0.0)
                            goto LAB_00bfb8bb;
                          }
                          (((Vec3f *)((long)local_4f8.ray + 0x30))->field_0).field_0.x =
                               *(float *)local_4f8.hit;
                          (((Vec3f *)((long)local_4f8.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_4f8.hit + 4);
                          (((Vec3f *)((long)local_4f8.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_4f8.hit + 8);
                          *(float *)((long)local_4f8.ray + 0x3c) = *(float *)(local_4f8.hit + 0xc);
                          *(float *)((long)local_4f8.ray + 0x40) = *(float *)(local_4f8.hit + 0x10);
                          *(float *)((long)local_4f8.ray + 0x44) = *(float *)(local_4f8.hit + 0x14);
                          *(float *)((long)local_4f8.ray + 0x48) = *(float *)(local_4f8.hit + 0x18);
                          *(float *)((long)local_4f8.ray + 0x4c) = *(float *)(local_4f8.hit + 0x1c);
                          pRVar68 = (RTCIntersectArguments *)
                                    (ulong)(uint)*(float *)(local_4f8.hit + 0x20);
                          *(float *)((long)local_4f8.ray + 0x50) = *(float *)(local_4f8.hit + 0x20);
                          pRVar66 = (RayHit *)local_4f8.ray;
                        }
                        else {
                          (*pGVar17->intersectionFilterN)(&local_4f8);
                          if ((((RayK<1> *)local_4f8.valid)->org).field_0.m128[0] != 0.0)
                          goto LAB_00bfb813;
LAB_00bfb8bb:
                          (ray->super_RayK<1>).tfar = fVar80;
                          pRVar66 = (RayHit *)local_4f8.valid;
                        }
                      }
                    }
                  }
                }
                bVar74 = lVar73 == 0;
                lVar73 = lVar73 + -1;
                pRVar65 = (RayHit *)CONCAT71((int7)((ulong)pRVar66 >> 8),bVar74);
              } while ((!bVar23) && (!bVar74));
              fVar168 = (ray->super_RayK<1>).tfar;
              local_328._0_4_ = -(uint)(local_3e8 <= fVar168) & local_328._0_4_;
              local_328._4_4_ = -(uint)(fStack_3e4 <= fVar168) & local_328._4_4_;
              local_328._8_4_ = -(uint)(fStack_3e0 <= fVar168) & local_328._8_4_;
              local_328._12_4_ = -(uint)(fStack_3dc <= fVar168) & local_328._12_4_;
              uVar67 = (undefined4)((ulong)pRVar66 >> 0x20);
              iVar61 = movmskps((int)pRVar65,local_328);
            } while (iVar61 != 0);
          }
          fVar168 = (ray->super_RayK<1>).tfar;
          local_428._0_4_ = -(uint)((float)local_428._0_4_ + local_3c8 <= fVar168) & local_308._0_4_
          ;
          local_428._4_4_ =
               -(uint)((float)local_428._4_4_ + fStack_3c4 <= fVar168) & local_308._4_4_;
          fStack_420 = (float)(-(uint)(fStack_420 + fStack_3c0 <= fVar168) & (uint)fStack_300);
          fStack_41c = (float)(-(uint)(fStack_41c + fStack_3bc <= fVar168) & (uint)fStack_2fc);
          local_418._0_4_ =
               -(uint)((int)local_358 <
                      ((int)((local_418._0_4_ & local_438._0_4_) << 0x1f) >> 0x1f) + 4);
          local_418._4_4_ =
               -(uint)((int)fStack_354 <
                      ((int)((local_418._4_4_ & local_438._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_410 = (float)-(uint)((int)fStack_350 <
                                     ((int)(((uint)fStack_410 & (uint)fStack_430) << 0x1f) >> 0x1f)
                                     + 4);
          fStack_40c = (float)-(uint)((int)fStack_34c <
                                     ((int)(((uint)fStack_40c & (uint)fStack_42c) << 0x1f) >> 0x1f)
                                     + 4);
          local_338 = ~_local_418 & _local_428;
          iVar61 = movmskps(iVar61,local_338);
          if (iVar61 != 0) {
            local_3d8 = _local_268;
            local_3e8 = local_3c8 + (float)local_268._0_4_;
            fStack_3e4 = fStack_3c4 + (float)local_268._4_4_;
            fStack_3e0 = fStack_3c0 + fStack_260;
            fStack_3dc = fStack_3bc + fStack_25c;
            do {
              auVar156 = ~local_338 & _DAT_01feb9f0 | local_338 & local_3d8;
              auVar180._4_4_ = auVar156._0_4_;
              auVar180._0_4_ = auVar156._4_4_;
              auVar180._8_4_ = auVar156._12_4_;
              auVar180._12_4_ = auVar156._8_4_;
              auVar82 = minps(auVar180,auVar156);
              auVar148._0_8_ = auVar82._8_8_;
              auVar148._8_4_ = auVar82._0_4_;
              auVar148._12_4_ = auVar82._4_4_;
              auVar82 = minps(auVar148,auVar82);
              auVar149._0_8_ =
                   CONCAT44(-(uint)(auVar82._4_4_ == auVar156._4_4_) & local_338._4_4_,
                            -(uint)(auVar82._0_4_ == auVar156._0_4_) & local_338._0_4_);
              auVar149._8_4_ = -(uint)(auVar82._8_4_ == auVar156._8_4_) & local_338._8_4_;
              auVar149._12_4_ = -(uint)(auVar82._12_4_ == auVar156._12_4_) & local_338._12_4_;
              iVar61 = movmskps(iVar61,auVar149);
              auVar114 = local_338;
              if (iVar61 != 0) {
                auVar114._8_4_ = auVar149._8_4_;
                auVar114._0_8_ = auVar149._0_8_;
                auVar114._12_4_ = auVar149._12_4_;
              }
              uVar62 = movmskps(iVar61,auVar114);
              pRVar65 = (RayHit *)0x0;
              if (CONCAT44(uVar67,uVar62) != 0) {
                for (; (CONCAT44(uVar67,uVar62) >> (long)pRVar65 & 1) == 0;
                    pRVar65 = (RayHit *)((long)(pRVar65->super_RayK<1>).org.field_0.m128 + 1)) {
                }
              }
              *(undefined4 *)(local_338 + (long)pRVar65 * 4) = 0;
              fVar168 = local_2d8[(long)pRVar65];
              auVar246 = ZEXT416(*(uint *)(local_258 + (long)pRVar65 * 4));
              local_588 = (ray->super_RayK<1>).dir.field_0.m128[0];
              fStack_584 = (ray->super_RayK<1>).dir.field_0.m128[1];
              fStack_580 = (ray->super_RayK<1>).dir.field_0.m128[2];
              fStack_57c = (ray->super_RayK<1>).dir.field_0.m128[3];
              fVar80 = fStack_580 * fStack_580 + fStack_584 * fStack_584 + local_588 * local_588;
              if (fVar80 < 0.0) {
                fVar80 = sqrtf(fVar80);
                pRVar65 = extraout_RAX_03;
              }
              else {
                fVar80 = SQRT(fVar80);
              }
              auVar30._4_4_ = fStack_504;
              auVar30._0_4_ = local_508;
              auVar30._8_4_ = fStack_500;
              auVar30._12_4_ = fStack_4fc;
              auVar156 = minps(_local_568,auVar30);
              auVar267 = maxps(_local_568,auVar30);
              auVar32._4_4_ = fStack_484;
              auVar32._0_4_ = local_488;
              auVar32._8_4_ = fStack_480;
              auVar32._12_4_ = fStack_47c;
              auVar34._4_4_ = fStack_474;
              auVar34._0_4_ = local_478;
              auVar34._8_4_ = fStack_470;
              auVar34._12_4_ = fStack_46c;
              auVar82 = minps(auVar32,auVar34);
              auVar156 = minps(auVar156,auVar82);
              auVar82 = maxps(auVar32,auVar34);
              auVar82 = maxps(auVar267,auVar82);
              auVar195._0_8_ = auVar156._0_8_ & 0x7fffffff7fffffff;
              auVar195._8_4_ = auVar156._8_4_ & 0x7fffffff;
              auVar195._12_4_ = auVar156._12_4_ & 0x7fffffff;
              local_4c8._4_4_ = auVar82._12_4_;
              auVar115._0_8_ = auVar82._0_8_ & 0x7fffffff7fffffff;
              auVar115._8_4_ = auVar82._8_4_ & 0x7fffffff;
              auVar115._12_4_ = local_4c8._4_4_ & 0x7fffffff;
              auVar82 = maxps(auVar195,auVar115);
              fVar120 = auVar82._4_4_;
              if (auVar82._4_4_ <= auVar82._0_4_) {
                fVar120 = auVar82._0_4_;
              }
              auVar196._8_8_ = auVar82._8_8_;
              auVar196._0_8_ = auVar82._8_8_;
              if (auVar82._8_4_ <= fVar120) {
                auVar196._0_4_ = fVar120;
              }
              register0x00001304 = auVar196._4_12_;
              local_598._0_4_ = auVar196._0_4_ * 1.9073486e-06;
              local_388 = fVar80 * 1.9073486e-06;
              local_4c8._0_4_ = local_4c8._4_4_;
              fStack_4c0 = (float)local_4c8._4_4_;
              fStack_4bc = (float)local_4c8._4_4_;
              lVar73 = 4;
              do {
                fVar80 = 1.0 - fVar168;
                fVar153 = local_508 * fVar80 + local_488 * fVar168;
                fVar167 = fStack_504 * fVar80 + fStack_484 * fVar168;
                fVar169 = fStack_500 * fVar80 + fStack_480 * fVar168;
                fVar184 = fStack_4fc * fVar80 + fStack_47c * fVar168;
                fVar120 = ((float)local_568._0_4_ * fVar80 + local_508 * fVar168) * fVar80 +
                          fVar168 * fVar153;
                fVar122 = ((float)local_568._4_4_ * fVar80 + fStack_504 * fVar168) * fVar80 +
                          fVar168 * fVar167;
                fVar125 = (fStack_560 * fVar80 + fStack_500 * fVar168) * fVar80 + fVar168 * fVar169;
                fVar152 = (fStack_55c * fVar80 + fStack_4fc * fVar168) * fVar80 + fVar168 * fVar184;
                fVar154 = fVar153 * fVar80 + (local_488 * fVar80 + local_478 * fVar168) * fVar168;
                fVar167 = fVar167 * fVar80 + (fStack_484 * fVar80 + fStack_474 * fVar168) * fVar168;
                fVar169 = fVar169 * fVar80 + (fStack_480 * fVar80 + fStack_470 * fVar168) * fVar168;
                fVar184 = fVar184 * fVar80 + (fStack_47c * fVar80 + fStack_46c * fVar168) * fVar168;
                fVar153 = auVar246._0_4_;
                local_368._0_4_ = fVar80 * fVar120 + fVar168 * fVar154;
                local_368._4_4_ = fVar80 * fVar122 + fVar168 * fVar167;
                fStack_360 = fVar80 * fVar125 + fVar168 * fVar169;
                fStack_35c = fVar80 * fVar152 + fVar168 * fVar184;
                fVar154 = (fVar154 - fVar120) * 3.0;
                fVar167 = (fVar167 - fVar122) * 3.0;
                fVar169 = (fVar169 - fVar125) * 3.0;
                fVar152 = (fVar184 - fVar152) * 3.0;
                local_528._0_4_ = (fVar153 * local_588 + 0.0) - (float)local_368._0_4_;
                local_528._4_4_ = (fVar153 * fStack_584 + 0.0) - (float)local_368._4_4_;
                fStack_520 = (fVar153 * fStack_580 + 0.0) - fStack_360;
                fStack_51c = (fVar153 * fStack_57c + 0.0) - fStack_35c;
                fVar120 = (float)local_528._4_4_ * (float)local_528._4_4_;
                fVar122 = fStack_520 * fStack_520;
                fVar125 = fStack_51c * fStack_51c;
                local_578._0_4_ =
                     fVar120 + (float)local_528._0_4_ * (float)local_528._0_4_ + fVar122;
                local_578._4_4_ = fVar120 + fVar120 + fVar125;
                fStack_570 = fVar120 + fVar122 + fVar122;
                fStack_56c = fVar120 + fVar125 + fVar125;
                local_378 = (float)local_578._0_4_;
                if ((float)local_578._0_4_ < 0.0) {
                  local_5b8 = ZEXT416((uint)fVar80);
                  fVar120 = sqrtf((float)local_578._0_4_);
                  pRVar66 = extraout_RAX_04;
                  fVar80 = (float)local_5b8._0_4_;
                }
                else {
                  fVar120 = SQRT((float)local_578._0_4_);
                  pRVar66 = pRVar65;
                }
                fVar184 = fVar80 * 6.0;
                fVar122 = (fVar168 - (fVar80 + fVar80)) * 6.0;
                fVar125 = (fVar80 - (fVar168 + fVar168)) * 6.0;
                fVar80 = fVar168 * 6.0;
                fVar185 = fVar184 * (float)local_568._0_4_ +
                          fVar122 * local_508 + fVar125 * local_488 + fVar80 * local_478;
                fVar186 = fVar184 * (float)local_568._4_4_ +
                          fVar122 * fStack_504 + fVar125 * fStack_484 + fVar80 * fStack_474;
                fVar203 = fVar184 * fStack_560 +
                          fVar122 * fStack_500 + fVar125 * fStack_480 + fVar80 * fStack_470;
                local_4b8 = (float)local_598._0_4_;
                if ((float)local_598._0_4_ <= local_388 * fVar153) {
                  local_4b8 = local_388 * fVar153;
                }
                fVar204 = fVar167 * fVar167 + fVar154 * fVar154 + fVar169 * fVar169;
                auVar156 = ZEXT416((uint)fVar204);
                auVar82 = rsqrtss(ZEXT416((uint)fVar204),auVar156);
                fVar205 = auVar82._0_4_;
                fVar205 = fVar205 * fVar205 * fVar204 * -0.5 * fVar205 + fVar205 * 1.5;
                fVar227 = fVar169 * fVar203 + fVar167 * fVar186 + fVar154 * fVar185;
                auVar82 = rcpss(auVar156,auVar156);
                fVar228 = (2.0 - fVar204 * auVar82._0_4_) * auVar82._0_4_;
                local_558 = fVar228 * (fVar204 * fVar185 - fVar227 * fVar154) * fVar205;
                fStack_554 = fVar228 * (fVar204 * fVar186 - fVar227 * fVar167) * fVar205;
                fStack_550 = fVar228 * (fVar204 * fVar203 - fVar227 * fVar169) * fVar205;
                fStack_54c = fVar228 * (fVar204 * (fVar184 * fStack_55c +
                                                  fVar122 * fStack_4fc +
                                                  fVar125 * fStack_47c + fVar80 * fStack_46c) -
                                       fVar227 * fVar152) * fVar205;
                fStack_4b4 = (float)local_598._4_4_;
                fStack_4b0 = fStack_590;
                fStack_4ac = fStack_58c;
                if (fVar204 < 0.0) {
                  local_5b8._0_4_ = fVar120;
                  local_548 = fVar154 * fVar205;
                  fStack_544 = fVar167 * fVar205;
                  fStack_540 = fVar169 * fVar205;
                  fStack_53c = fVar152 * fVar205;
                  local_538 = -fVar154;
                  fStack_534 = -fVar167;
                  fStack_530 = -fVar169;
                  fStack_52c = -fVar152;
                  fVar204 = sqrtf(fVar204);
                  pRVar66 = extraout_RAX_05;
                  fVar80 = local_538;
                  fVar122 = fStack_534;
                  fVar125 = fStack_530;
                  fVar184 = fStack_52c;
                  fVar120 = (float)local_5b8._0_4_;
                  fVar185 = local_548;
                  fVar186 = fStack_544;
                  fVar203 = fStack_540;
                  fVar205 = fStack_53c;
                }
                else {
                  fVar204 = SQRT(fVar204);
                  fVar80 = -fVar154;
                  fVar122 = -fVar167;
                  fVar125 = -fVar169;
                  fVar184 = -fVar152;
                  fVar185 = fVar154 * fVar205;
                  fVar186 = fVar167 * fVar205;
                  fVar203 = fVar169 * fVar205;
                  fVar205 = fVar152 * fVar205;
                }
                fVar227 = (float)local_528._4_4_ * fVar186;
                fVar232 = fStack_520 * fVar203;
                fVar233 = fStack_51c * fVar205;
                fVar229 = fVar227 + (float)local_528._0_4_ * fVar185 + fVar232;
                fVar234 = fVar227 + fVar227 + fVar233;
                fVar232 = fVar227 + fVar232 + fVar232;
                fVar233 = fVar227 + fVar233 + fVar233;
                fVar227 = (fVar120 + 1.0) * ((float)local_598._0_4_ / fVar204) +
                          fVar120 * (float)local_598._0_4_ + local_4b8;
                fVar204 = fStack_57c * fVar205;
                fVar205 = fVar205 * fVar184;
                fVar228 = fVar203 * fVar125 + fVar186 * fVar122 + fVar185 * fVar80 +
                          fStack_550 * fStack_520 +
                          fStack_554 * (float)local_528._4_4_ + local_558 * (float)local_528._0_4_;
                fVar120 = fStack_580 * fVar203 + fStack_584 * fVar186 + local_588 * fVar185;
                fVar185 = local_578._0_4_ - fVar229 * fVar229;
                auVar116._0_8_ = CONCAT44(local_578._4_4_ - fVar234 * fVar234,fVar185);
                auVar116._8_4_ = local_578._8_4_ - fVar232 * fVar232;
                auVar116._12_4_ = local_578._12_4_ - fVar233 * fVar233;
                fVar184 = fVar184 * fStack_51c;
                fVar80 = (fVar125 * fStack_520 +
                         fVar122 * (float)local_528._4_4_ + fVar80 * (float)local_528._0_4_) -
                         fVar229 * fVar228;
                fStack_550 = fStack_580 * fStack_520;
                fStack_554 = fStack_57c * fStack_51c;
                local_558 = (fStack_550 +
                            fStack_584 * (float)local_528._4_4_ + local_588 * (float)local_528._0_4_
                            ) - fVar229 * fVar120;
                auVar181._8_4_ = auVar116._8_4_;
                auVar181._0_8_ = auVar116._0_8_;
                auVar181._12_4_ = auVar116._12_4_;
                auVar82 = rsqrtss(auVar181,auVar116);
                fVar122 = auVar82._0_4_;
                auVar182._4_12_ = auVar82._4_12_;
                auVar182._0_4_ = fVar122 * fVar122 * fVar185 * -0.5 * fVar122 + fVar122 * 1.5;
                fStack_54c = fStack_554;
                if (fVar185 < 0.0) {
                  local_5b8._0_4_ = fVar227;
                  local_548 = fVar228;
                  fStack_544 = fVar205;
                  fStack_540 = fVar203 * fVar125;
                  fStack_53c = fVar205;
                  local_538 = fVar80;
                  fStack_534 = fVar184;
                  fStack_530 = fVar125 * fStack_520;
                  fStack_52c = fVar184;
                  _local_3b8 = auVar182;
                  local_3a8 = fVar120;
                  fStack_3a4 = fVar204;
                  fStack_3a0 = fStack_580 * fVar203;
                  fStack_39c = fVar204;
                  local_398 = fVar229;
                  fStack_394 = fVar234;
                  fStack_390 = fVar232;
                  fStack_38c = fVar233;
                  fVar185 = sqrtf(fVar185);
                  pRVar66 = extraout_RAX_06;
                  auVar182 = _local_3b8;
                  fVar120 = local_3a8;
                  fVar204 = fStack_3a4;
                  fVar80 = local_538;
                  fVar184 = fStack_534;
                  fVar227 = (float)local_5b8._0_4_;
                  fVar228 = local_548;
                  fVar205 = fStack_544;
                  fVar229 = local_398;
                }
                else {
                  fVar185 = SQRT(fVar185);
                }
                fVar185 = fVar185 - fStack_35c;
                fVar80 = fVar80 * auVar182._0_4_ - fVar152;
                auVar28._4_4_ = fStack_554;
                auVar28._0_4_ = local_558;
                auVar28._8_4_ = fStack_550;
                auVar28._12_4_ = fStack_54c;
                auVar160._4_12_ = auVar28._4_12_;
                auVar160._0_4_ = local_558 * auVar182._0_4_;
                auVar258._0_8_ = CONCAT44(fVar184,fVar80) ^ 0x8000000080000000;
                auVar258._8_4_ = -fVar184;
                auVar258._12_4_ = fVar205;
                auVar257._8_8_ = auVar258._8_8_;
                auVar257._0_8_ = CONCAT44(fVar228,fVar80) ^ 0x80000000;
                auVar304._0_4_ = fVar228 * auVar160._0_4_ - fVar120 * fVar80;
                auVar162._0_8_ = auVar160._0_8_;
                auVar162._8_4_ = fStack_554;
                auVar162._12_4_ = -fVar204;
                auVar161._8_8_ = auVar162._8_8_;
                auVar161._0_8_ = CONCAT44(fVar120,auVar160._0_4_) ^ 0x8000000000000000;
                auVar304._4_4_ = auVar304._0_4_;
                auVar304._8_4_ = auVar304._0_4_;
                auVar304._12_4_ = auVar304._0_4_;
                auVar82 = divps(auVar161,auVar304);
                auVar156 = divps(auVar257,auVar304);
                fVar168 = fVar168 - (auVar82._4_4_ * fVar185 + auVar82._0_4_ * fVar229);
                auVar246._0_4_ = fVar153 - (auVar156._4_4_ * fVar185 + auVar156._0_4_ * fVar229);
                if ((fVar227 <= ABS(fVar229)) ||
                   ((float)local_4c8._0_4_ * 1.9073486e-06 + local_4b8 + fVar227 <= ABS(fVar185))) {
                  bVar23 = false;
                }
                else {
                  auVar246._0_4_ = auVar246._0_4_ + (float)local_2e8._0_4_;
                  bVar23 = true;
                  if (((((ray->super_RayK<1>).org.field_0.m128[3] <= auVar246._0_4_) &&
                       (fVar80 = (ray->super_RayK<1>).tfar, auVar246._0_4_ <= fVar80)) &&
                      (0.0 <= fVar168)) && (fVar168 <= 1.0)) {
                    auVar82 = rsqrtss(_local_578,_local_578);
                    fVar120 = auVar82._0_4_;
                    pGVar17 = (context->scene->geometries).items[(long)local_5a0].ptr;
                    uVar75 = (ray->super_RayK<1>).mask;
                    pRVar66 = (RayHit *)(ulong)uVar75;
                    pRVar68 = local_5a0;
                    if ((pGVar17->mask & uVar75) != 0) {
                      fVar120 = fVar120 * 1.5 + fVar120 * fVar120 * local_378 * -0.5 * fVar120;
                      fVar153 = (float)local_528._0_4_ * fVar120;
                      fVar185 = (float)local_528._4_4_ * fVar120;
                      fVar120 = fStack_520 * fVar120;
                      fVar125 = fVar152 * fVar153 + fVar154;
                      fVar122 = fVar152 * fVar185 + fVar167;
                      fVar152 = fVar152 * fVar120 + fVar169;
                      fVar184 = fVar185 * fVar154 - fVar167 * fVar153;
                      fVar167 = fVar120 * fVar167 - fVar169 * fVar185;
                      fVar153 = fVar153 * fVar169 - fVar154 * fVar120;
                      fVar120 = fVar122 * fVar167 - fVar153 * fVar125;
                      fVar122 = fVar152 * fVar153 - fVar184 * fVar122;
                      fVar125 = fVar125 * fVar184 - fVar167 * fVar152;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar17->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = auVar246._0_4_;
                        *(ulong *)&(ray->Ng).field_0 = CONCAT44(fVar125,fVar122);
                        (ray->Ng).field_0.field_0.z = fVar120;
                        ray->u = fVar168;
                        ray->v = 0.0;
                        ray->primID = (uint)local_510;
                        ray->geomID = (uint)local_5a0;
                        ray->instID[0] = context->user->instID[0];
                        uVar75 = context->user->instPrimID[0];
                        ray->instPrimID[0] = uVar75;
                        pRVar66 = (RayHit *)(ulong)uVar75;
                      }
                      else {
                        local_468 = CONCAT44(fVar125,fVar122);
                        fStack_460 = fVar120;
                        fStack_45c = fVar168;
                        local_458 = 0;
                        local_454 = (uint)local_510;
                        local_450 = (uint)local_5a0;
                        local_44c = context->user->instID[0];
                        pRVar68 = (RTCIntersectArguments *)(ulong)local_44c;
                        local_448 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = auVar246._0_4_;
                        local_5bc = 0xffffffff;
                        local_4f8.geometryUserPtr = pGVar17->userPtr;
                        local_4f8.valid = &local_5bc;
                        local_4f8.context = context->user;
                        local_4f8.hit = (RTCHitN *)&local_468;
                        local_4f8.N = 1;
                        local_4f8.ray = (RTCRayN *)ray;
                        if (pGVar17->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00bfc2dd:
                          pRVar68 = context->args;
                          if (pRVar68->filter != (RTCFilterFunctionN)0x0) {
                            if (((pRVar68->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar17->field_8).field_0x2 & 0x40) != 0)) {
                              (*pRVar68->filter)(&local_4f8);
                            }
                            if ((((RayK<1> *)local_4f8.valid)->org).field_0.m128[0] == 0.0)
                            goto LAB_00bfc385;
                          }
                          (((Vec3f *)((long)local_4f8.ray + 0x30))->field_0).field_0.x =
                               *(float *)local_4f8.hit;
                          (((Vec3f *)((long)local_4f8.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_4f8.hit + 4);
                          (((Vec3f *)((long)local_4f8.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_4f8.hit + 8);
                          *(float *)((long)local_4f8.ray + 0x3c) = *(float *)(local_4f8.hit + 0xc);
                          *(float *)((long)local_4f8.ray + 0x40) = *(float *)(local_4f8.hit + 0x10);
                          *(float *)((long)local_4f8.ray + 0x44) = *(float *)(local_4f8.hit + 0x14);
                          *(float *)((long)local_4f8.ray + 0x48) = *(float *)(local_4f8.hit + 0x18);
                          *(float *)((long)local_4f8.ray + 0x4c) = *(float *)(local_4f8.hit + 0x1c);
                          pRVar68 = (RTCIntersectArguments *)
                                    (ulong)(uint)*(float *)(local_4f8.hit + 0x20);
                          *(float *)((long)local_4f8.ray + 0x50) = *(float *)(local_4f8.hit + 0x20);
                          pRVar66 = (RayHit *)local_4f8.ray;
                        }
                        else {
                          (*pGVar17->intersectionFilterN)(&local_4f8);
                          if ((((RayK<1> *)local_4f8.valid)->org).field_0.m128[0] != 0.0)
                          goto LAB_00bfc2dd;
LAB_00bfc385:
                          (ray->super_RayK<1>).tfar = fVar80;
                          pRVar66 = (RayHit *)local_4f8.valid;
                        }
                      }
                    }
                  }
                }
                bVar74 = lVar73 == 0;
                lVar73 = lVar73 + -1;
                pRVar65 = (RayHit *)CONCAT71((int7)((ulong)pRVar66 >> 8),bVar74);
              } while ((!bVar23) && (!bVar74));
              fVar168 = (ray->super_RayK<1>).tfar;
              local_338._0_4_ = -(uint)(local_3e8 <= fVar168) & local_338._0_4_;
              local_338._4_4_ = -(uint)(fStack_3e4 <= fVar168) & local_338._4_4_;
              local_338._8_4_ = -(uint)(fStack_3e0 <= fVar168) & local_338._8_4_;
              local_338._12_4_ = -(uint)(fStack_3dc <= fVar168) & local_338._12_4_;
              uVar67 = (undefined4)((ulong)pRVar66 >> 0x20);
              iVar61 = movmskps((int)pRVar65,local_338);
            } while (iVar61 != 0);
          }
          fVar168 = (ray->super_RayK<1>).tfar;
          auVar197._0_4_ =
               local_498._0_4_ & local_318._0_4_ &
               -(uint)(local_3c8 + (float)local_118._0_4_ <= fVar168);
          auVar197._4_4_ =
               local_498._4_4_ & local_318._4_4_ &
               -(uint)(fStack_3c4 + (float)local_118._4_4_ <= fVar168);
          auVar197._8_4_ =
               (uint)fStack_490 & (uint)fStack_310 & -(uint)(fStack_3c0 + fStack_110 <= fVar168);
          auVar197._12_4_ =
               (uint)fStack_48c & (uint)fStack_30c & -(uint)(fStack_3bc + fStack_10c <= fVar168);
          auVar163._0_4_ =
               local_418._0_4_ & local_428._0_4_ &
               -(uint)(local_3c8 + (float)local_268._0_4_ <= fVar168);
          auVar163._4_4_ =
               local_418._4_4_ & local_428._4_4_ &
               -(uint)(fStack_3c4 + (float)local_268._4_4_ <= fVar168);
          auVar163._8_4_ =
               (uint)fStack_410 & (uint)fStack_420 & -(uint)(fStack_3c0 + fStack_260 <= fVar168);
          auVar163._12_4_ =
               (uint)fStack_40c & (uint)fStack_41c & -(uint)(fStack_3bc + fStack_25c <= fVar168);
          iVar61 = movmskps(iVar61,auVar163 | auVar197);
          if (iVar61 != 0) {
            *(undefined1 (*) [16])(auStack_f8 + uVar69 * 0xc) = auVar163 | auVar197;
            auVar117._0_4_ = local_118._0_4_ & auVar197._0_4_;
            auVar117._4_4_ = local_118._4_4_ & auVar197._4_4_;
            auVar117._8_4_ = (uint)fStack_110 & auVar197._8_4_;
            auVar117._12_4_ = (uint)fStack_10c & auVar197._12_4_;
            auVar198._0_4_ = ~auVar197._0_4_ & local_268._0_4_;
            auVar198._4_4_ = ~auVar197._4_4_ & local_268._4_4_;
            auVar198._8_4_ = ~auVar197._8_4_ & (uint)fStack_260;
            auVar198._12_4_ = ~auVar197._12_4_ & (uint)fStack_25c;
            *(undefined1 (*) [16])(afStack_e8 + uVar69 * 0xc) = auVar198 | auVar117;
            afStack_d0[uVar69 * 0xc + -2] = local_408;
            afStack_d0[uVar69 * 0xc + -1] = fStack_404;
            fVar168 = (float)((int)local_4a0 + 1);
            pRVar68 = (RTCIntersectArguments *)(ulong)(uint)fVar168;
            afStack_d0[uVar69 * 0xc] = fVar168;
            uVar64 = (ulong)((int)uVar69 + 1);
          }
        }
      }
    }
    fVar120 = (ray->super_RayK<1>).tfar;
    fVar168 = local_408;
    fVar80 = fStack_404;
    uVar67 = uStack_400;
    uVar62 = uStack_3fc;
    do {
      uVar75 = (uint)uVar64;
      if (uVar75 == 0) {
        fVar168 = (ray->super_RayK<1>).tfar;
        auVar151._4_4_ = -(uint)(fStack_244 <= fVar168);
        auVar151._0_4_ = -(uint)(local_248 <= fVar168);
        auVar151._8_4_ = -(uint)(fStack_240 <= fVar168);
        auVar151._12_4_ = -(uint)(fStack_23c <= fVar168);
        uVar75 = movmskps((int)pRVar68,auVar151);
        uVar75 = (uint)local_2a0 - 1 & (uint)local_2a0 & uVar75;
        if (uVar75 == 0) {
          return;
        }
        goto LAB_00bf9d69;
      }
      uVar64 = (ulong)(uVar75 - 1);
      local_4f8.valid._0_4_ =
           -(uint)(local_3c8 + afStack_e8[uVar64 * 0xc] <= fVar120) & auStack_f8[uVar64 * 0xc];
      local_4f8.valid._4_4_ =
           -(uint)(fStack_3c4 + afStack_e8[uVar64 * 0xc + 1] <= fVar120) &
           auStack_f8[uVar64 * 0xc + 1];
      local_4f8.geometryUserPtr._0_4_ =
           -(uint)(fStack_3c0 + afStack_e8[uVar64 * 0xc + 2] <= fVar120) &
           auStack_f8[uVar64 * 0xc + 2];
      local_4f8.geometryUserPtr._4_4_ =
           -(uint)(fStack_3bc + afStack_e8[uVar64 * 0xc + 3] <= fVar120) &
           (uint)afStack_e8[uVar64 * 0xc + -1];
      uVar76 = movmskps((int)pRVar68,(undefined1  [16])local_4f8._0_16_);
      pRVar68 = (RTCIntersectArguments *)(ulong)uVar76;
      if (uVar76 != 0) {
        auVar164._0_4_ = (uint)afStack_e8[uVar64 * 0xc] & (uint)local_4f8.valid;
        auVar164._4_4_ = (uint)afStack_e8[uVar64 * 0xc + 1] & local_4f8.valid._4_4_;
        auVar164._8_4_ = (uint)afStack_e8[uVar64 * 0xc + 2] & (uint)local_4f8.geometryUserPtr;
        auVar164._12_4_ = (uint)afStack_e8[uVar64 * 0xc + 3] & local_4f8.geometryUserPtr._4_4_;
        auVar183._0_8_ =
             CONCAT44(~local_4f8.valid._4_4_,~(uint)local_4f8.valid) & 0x7f8000007f800000;
        auVar183._8_4_ = ~(uint)local_4f8.geometryUserPtr & 0x7f800000;
        auVar183._12_4_ = ~local_4f8.geometryUserPtr._4_4_ & 0x7f800000;
        auVar183 = auVar183 | auVar164;
        auVar199._4_4_ = auVar183._0_4_;
        auVar199._0_4_ = auVar183._4_4_;
        auVar199._8_4_ = auVar183._12_4_;
        auVar199._12_4_ = auVar183._8_4_;
        auVar82 = minps(auVar199,auVar183);
        auVar165._0_8_ = auVar82._8_8_;
        auVar165._8_4_ = auVar82._0_4_;
        auVar165._12_4_ = auVar82._4_4_;
        auVar82 = minps(auVar165,auVar82);
        auVar166._0_8_ =
             CONCAT44(-(uint)(auVar82._4_4_ == auVar183._4_4_) & local_4f8.valid._4_4_,
                      -(uint)(auVar82._0_4_ == auVar183._0_4_) & (uint)local_4f8.valid);
        auVar166._8_4_ = -(uint)(auVar82._8_4_ == auVar183._8_4_) & (uint)local_4f8.geometryUserPtr;
        auVar166._12_4_ =
             -(uint)(auVar82._12_4_ == auVar183._12_4_) & local_4f8.geometryUserPtr._4_4_;
        iVar61 = movmskps((int)lVar70,auVar166);
        auVar150 = (undefined1  [16])local_4f8._0_16_;
        if (iVar61 != 0) {
          auVar150._8_4_ = auVar166._8_4_;
          auVar150._0_8_ = auVar166._0_8_;
          auVar150._12_4_ = auVar166._12_4_;
        }
        fVar168 = afStack_d0[uVar64 * 0xc + -2];
        fVar80 = afStack_d0[uVar64 * 0xc + -1];
        local_4a0 = (ulong)(uint)afStack_d0[uVar64 * 0xc];
        uVar77 = movmskps(afStack_d0[uVar64 * 0xc],auVar150);
        lVar70 = 0;
        if (uVar77 != 0) {
          for (; (uVar77 >> lVar70 & 1) == 0; lVar70 = lVar70 + 1) {
          }
        }
        *(undefined4 *)((long)&local_4f8.valid + lVar70 * 4) = 0;
        *(undefined1 (*) [16])(auStack_f8 + uVar64 * 0xc) = (undefined1  [16])local_4f8._0_16_;
        iVar61 = movmskps((int)(undefined1 (*) [16])(auStack_f8 + uVar64 * 0xc),
                          (undefined1  [16])local_4f8._0_16_);
        if (iVar61 == 0) {
          uVar75 = uVar75 - 1;
        }
        fVar80 = fVar80 - fVar168;
        local_468 = CONCAT44(fVar80 * 0.33333334 + fVar168,fVar80 * 0.0 + fVar168);
        fStack_460 = fVar80 * 0.6666667 + fVar168;
        fStack_45c = fVar80 * 1.0 + fVar168;
        fVar168 = *(float *)((long)&local_468 + lVar70 * 4);
        fVar80 = *(float *)((long)&local_468 + lVar70 * 4 + 4);
        uVar67 = 0;
        uVar62 = 0;
        uVar64 = (ulong)uVar75;
      }
      uVar69 = uVar64;
    } while ((char)uVar76 == '\0');
  } while( true );
}

Assistant:

static __forceinline void intersect_h(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time());
          Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }